

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float *pfVar1;
  undefined1 auVar2 [16];
  Primitive PVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  float fVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [12];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  byte bVar54;
  byte bVar55;
  uint uVar56;
  byte bVar57;
  uint uVar58;
  ulong uVar59;
  long lVar60;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ulong uVar61;
  int iVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  long lVar67;
  undefined1 uVar68;
  bool bVar69;
  undefined1 uVar70;
  ulong uVar71;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar80 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  uint uVar147;
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  float pp;
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar166 [64];
  float fVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined4 uVar229;
  float fVar230;
  float fVar237;
  float fVar238;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar239;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  float fVar246;
  undefined1 auVar245 [28];
  undefined1 auVar247 [32];
  float fVar250;
  undefined1 auVar248 [16];
  float fVar251;
  undefined1 auVar249 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  bool local_c41;
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [64];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte local_1a0 [32];
  undefined1 auStack_180 [32];
  float local_160 [2];
  int local_158 [74];
  undefined1 extraout_var_02 [60];
  
  PVar3 = prim[1];
  uVar71 = (ulong)(byte)PVar3;
  lVar67 = uVar71 * 0x25;
  fVar230 = *(float *)(prim + lVar67 + 0x12);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar79 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar80 = vsubps_avx(auVar72,*(undefined1 (*) [16])(prim + lVar67 + 6));
  fVar208 = fVar230 * auVar80._0_4_;
  fVar148 = fVar230 * auVar79._0_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar71 * 4 + 6);
  auVar84 = vpmovsxbd_avx2(auVar72);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar71 * 5 + 6);
  auVar85 = vpmovsxbd_avx2(auVar17);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar71 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar74);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar71 * 0xf + 6);
  auVar87 = vpmovsxbd_avx2(auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar93 = vpmovsxbd_avx2(auVar76);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar93);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar71 + 6);
  auVar89 = vpmovsxbd_avx2(auVar77);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar71 * 0x1a + 6);
  auVar90 = vpmovsxbd_avx2(auVar2);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar71 * 0x1b + 6);
  auVar91 = vpmovsxbd_avx2(auVar73);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar71 * 0x1c + 6);
  auVar83 = vpmovsxbd_avx2(auVar78);
  auVar92 = vcvtdq2ps_avx(auVar83);
  auVar100._4_4_ = fVar148;
  auVar100._0_4_ = fVar148;
  auVar100._8_4_ = fVar148;
  auVar100._12_4_ = fVar148;
  auVar100._16_4_ = fVar148;
  auVar100._20_4_ = fVar148;
  auVar100._24_4_ = fVar148;
  auVar100._28_4_ = fVar148;
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = ZEXT1632(CONCAT412(fVar230 * auVar79._12_4_,
                               CONCAT48(fVar230 * auVar79._8_4_,
                                        CONCAT44(fVar230 * auVar79._4_4_,fVar148))));
  auVar94 = vpermps_avx2(auVar105,auVar95);
  auVar82 = vpermps_avx512vl(auVar81,auVar95);
  fVar237 = auVar82._0_4_;
  fVar238 = auVar82._4_4_;
  auVar95._4_4_ = fVar238 * auVar86._4_4_;
  auVar95._0_4_ = fVar237 * auVar86._0_4_;
  fVar239 = auVar82._8_4_;
  auVar95._8_4_ = fVar239 * auVar86._8_4_;
  fVar246 = auVar82._12_4_;
  auVar95._12_4_ = fVar246 * auVar86._12_4_;
  fVar240 = auVar82._16_4_;
  auVar95._16_4_ = fVar240 * auVar86._16_4_;
  fVar241 = auVar82._20_4_;
  auVar95._20_4_ = fVar241 * auVar86._20_4_;
  fVar242 = auVar82._24_4_;
  auVar95._24_4_ = fVar242 * auVar86._24_4_;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar89._4_4_ * fVar238;
  auVar93._0_4_ = auVar89._0_4_ * fVar237;
  auVar93._8_4_ = auVar89._8_4_ * fVar239;
  auVar93._12_4_ = auVar89._12_4_ * fVar246;
  auVar93._16_4_ = auVar89._16_4_ * fVar240;
  auVar93._20_4_ = auVar89._20_4_ * fVar241;
  auVar93._24_4_ = auVar89._24_4_ * fVar242;
  auVar93._28_4_ = auVar83._28_4_;
  auVar83._4_4_ = auVar92._4_4_ * fVar238;
  auVar83._0_4_ = auVar92._0_4_ * fVar237;
  auVar83._8_4_ = auVar92._8_4_ * fVar239;
  auVar83._12_4_ = auVar92._12_4_ * fVar246;
  auVar83._16_4_ = auVar92._16_4_ * fVar240;
  auVar83._20_4_ = auVar92._20_4_ * fVar241;
  auVar83._24_4_ = auVar92._24_4_ * fVar242;
  auVar83._28_4_ = auVar82._28_4_;
  auVar72 = vfmadd231ps_fma(auVar95,auVar94,auVar85);
  auVar17 = vfmadd231ps_fma(auVar93,auVar94,auVar88);
  auVar74 = vfmadd231ps_fma(auVar83,auVar91,auVar94);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar100,auVar84);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar100,auVar87);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar90,auVar100);
  auVar104._4_4_ = fVar208;
  auVar104._0_4_ = fVar208;
  auVar104._8_4_ = fVar208;
  auVar104._12_4_ = fVar208;
  auVar104._16_4_ = fVar208;
  auVar104._20_4_ = fVar208;
  auVar104._24_4_ = fVar208;
  auVar104._28_4_ = fVar208;
  auVar83 = ZEXT1632(CONCAT412(fVar230 * auVar80._12_4_,
                               CONCAT48(fVar230 * auVar80._8_4_,
                                        CONCAT44(fVar230 * auVar80._4_4_,fVar208))));
  auVar93 = vpermps_avx2(auVar105,auVar83);
  auVar83 = vpermps_avx512vl(auVar81,auVar83);
  fVar230 = auVar83._0_4_;
  fVar237 = auVar83._4_4_;
  auVar94._4_4_ = fVar237 * auVar86._4_4_;
  auVar94._0_4_ = fVar230 * auVar86._0_4_;
  fVar238 = auVar83._8_4_;
  auVar94._8_4_ = fVar238 * auVar86._8_4_;
  fVar239 = auVar83._12_4_;
  auVar94._12_4_ = fVar239 * auVar86._12_4_;
  fVar246 = auVar83._16_4_;
  auVar94._16_4_ = fVar246 * auVar86._16_4_;
  fVar240 = auVar83._20_4_;
  auVar94._20_4_ = fVar240 * auVar86._20_4_;
  fVar241 = auVar83._24_4_;
  auVar94._24_4_ = fVar241 * auVar86._24_4_;
  auVar94._28_4_ = fVar148;
  auVar81._4_4_ = auVar89._4_4_ * fVar237;
  auVar81._0_4_ = auVar89._0_4_ * fVar230;
  auVar81._8_4_ = auVar89._8_4_ * fVar238;
  auVar81._12_4_ = auVar89._12_4_ * fVar239;
  auVar81._16_4_ = auVar89._16_4_ * fVar246;
  auVar81._20_4_ = auVar89._20_4_ * fVar240;
  auVar81._24_4_ = auVar89._24_4_ * fVar241;
  auVar81._28_4_ = auVar86._28_4_;
  auVar89._4_4_ = auVar92._4_4_ * fVar237;
  auVar89._0_4_ = auVar92._0_4_ * fVar230;
  auVar89._8_4_ = auVar92._8_4_ * fVar238;
  auVar89._12_4_ = auVar92._12_4_ * fVar239;
  auVar89._16_4_ = auVar92._16_4_ * fVar246;
  auVar89._20_4_ = auVar92._20_4_ * fVar240;
  auVar89._24_4_ = auVar92._24_4_ * fVar241;
  auVar89._28_4_ = auVar83._28_4_;
  auVar75 = vfmadd231ps_fma(auVar94,auVar93,auVar85);
  auVar76 = vfmadd231ps_fma(auVar81,auVar93,auVar88);
  auVar77 = vfmadd231ps_fma(auVar89,auVar93,auVar91);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar104,auVar84);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar104,auVar87);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar255 = ZEXT3264(auVar84);
  auVar168 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar104,auVar90);
  vandps_avx512vl(ZEXT1632(auVar72),auVar84);
  auVar102._8_4_ = 0x219392ef;
  auVar102._0_8_ = 0x219392ef219392ef;
  auVar102._12_4_ = 0x219392ef;
  auVar102._16_4_ = 0x219392ef;
  auVar102._20_4_ = 0x219392ef;
  auVar102._24_4_ = 0x219392ef;
  auVar102._28_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar84,auVar102,1);
  bVar69 = (bool)((byte)uVar59 & 1);
  auVar82._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._0_4_;
  bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._4_4_;
  bVar69 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._8_4_;
  bVar69 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar17),auVar84);
  uVar59 = vcmpps_avx512vl(auVar82,auVar102,1);
  bVar69 = (bool)((byte)uVar59 & 1);
  auVar96._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar17._0_4_;
  bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar17._4_4_;
  bVar69 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar17._8_4_;
  bVar69 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar17._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar74),auVar84);
  uVar59 = vcmpps_avx512vl(auVar96,auVar102,1);
  bVar69 = (bool)((byte)uVar59 & 1);
  auVar84._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._0_4_;
  bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._4_4_;
  bVar69 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._8_4_;
  bVar69 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar85 = vrcp14ps_avx512vl(auVar82);
  auVar103._8_4_ = 0x3f800000;
  auVar103._0_8_ = &DAT_3f8000003f800000;
  auVar103._12_4_ = 0x3f800000;
  auVar103._16_4_ = 0x3f800000;
  auVar103._20_4_ = 0x3f800000;
  auVar103._24_4_ = 0x3f800000;
  auVar103._28_4_ = 0x3f800000;
  auVar72 = vfnmadd213ps_fma(auVar82,auVar85,auVar103);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar96);
  auVar17 = vfnmadd213ps_fma(auVar96,auVar85,auVar103);
  auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar84);
  auVar74 = vfnmadd213ps_fma(auVar84,auVar85,auVar103);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar85,auVar85);
  fVar230 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar67 + 0x16)) *
            *(float *)(prim + lVar67 + 0x1a);
  auVar101._4_4_ = fVar230;
  auVar101._0_4_ = fVar230;
  auVar101._8_4_ = fVar230;
  auVar101._12_4_ = fVar230;
  auVar101._16_4_ = fVar230;
  auVar101._20_4_ = fVar230;
  auVar101._24_4_ = fVar230;
  auVar101._28_4_ = fVar230;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 7 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0xb + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 9 + 6));
  auVar75 = vfmadd213ps_fma(auVar85,auVar101,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar86);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0xd + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar76 = vfmadd213ps_fma(auVar85,auVar101,auVar84);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x12 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar59 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 2 + uVar59 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar77 = vfmadd213ps_fma(auVar85,auVar101,auVar84);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x18 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar2 = vfmadd213ps_fma(auVar85,auVar101,auVar84);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x1d + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 + (ulong)(byte)PVar3 * 0x20 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar73 = vfmadd213ps_fma(auVar85,auVar101,auVar84);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar3 * 0x20 - uVar71) + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x23 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar78 = vfmadd213ps_fma(auVar85,auVar101,auVar84);
  auVar84 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar79));
  auVar90._4_4_ = auVar72._4_4_ * auVar84._4_4_;
  auVar90._0_4_ = auVar72._0_4_ * auVar84._0_4_;
  auVar90._8_4_ = auVar72._8_4_ * auVar84._8_4_;
  auVar90._12_4_ = auVar72._12_4_ * auVar84._12_4_;
  auVar90._16_4_ = auVar84._16_4_ * 0.0;
  auVar90._20_4_ = auVar84._20_4_ * 0.0;
  auVar90._24_4_ = auVar84._24_4_ * 0.0;
  auVar90._28_4_ = auVar84._28_4_;
  auVar84 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar79));
  auVar99._0_4_ = auVar72._0_4_ * auVar84._0_4_;
  auVar99._4_4_ = auVar72._4_4_ * auVar84._4_4_;
  auVar99._8_4_ = auVar72._8_4_ * auVar84._8_4_;
  auVar99._12_4_ = auVar72._12_4_ * auVar84._12_4_;
  auVar99._16_4_ = auVar84._16_4_ * 0.0;
  auVar99._20_4_ = auVar84._20_4_ * 0.0;
  auVar99._24_4_ = auVar84._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar84 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar80));
  auVar91._4_4_ = auVar17._4_4_ * auVar84._4_4_;
  auVar91._0_4_ = auVar17._0_4_ * auVar84._0_4_;
  auVar91._8_4_ = auVar17._8_4_ * auVar84._8_4_;
  auVar91._12_4_ = auVar17._12_4_ * auVar84._12_4_;
  auVar91._16_4_ = auVar84._16_4_ * 0.0;
  auVar91._20_4_ = auVar84._20_4_ * 0.0;
  auVar91._24_4_ = auVar84._24_4_ * 0.0;
  auVar91._28_4_ = auVar84._28_4_;
  auVar84 = vsubps_avx(ZEXT1632(auVar2),ZEXT1632(auVar80));
  auVar98._0_4_ = auVar17._0_4_ * auVar84._0_4_;
  auVar98._4_4_ = auVar17._4_4_ * auVar84._4_4_;
  auVar98._8_4_ = auVar17._8_4_ * auVar84._8_4_;
  auVar98._12_4_ = auVar17._12_4_ * auVar84._12_4_;
  auVar98._16_4_ = auVar84._16_4_ * 0.0;
  auVar98._20_4_ = auVar84._20_4_ * 0.0;
  auVar98._24_4_ = auVar84._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar84 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar168));
  auVar92._4_4_ = auVar74._4_4_ * auVar84._4_4_;
  auVar92._0_4_ = auVar74._0_4_ * auVar84._0_4_;
  auVar92._8_4_ = auVar74._8_4_ * auVar84._8_4_;
  auVar92._12_4_ = auVar74._12_4_ * auVar84._12_4_;
  auVar92._16_4_ = auVar84._16_4_ * 0.0;
  auVar92._20_4_ = auVar84._20_4_ * 0.0;
  auVar92._24_4_ = auVar84._24_4_ * 0.0;
  auVar92._28_4_ = auVar84._28_4_;
  auVar84 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar168));
  auVar97._0_4_ = auVar74._0_4_ * auVar84._0_4_;
  auVar97._4_4_ = auVar74._4_4_ * auVar84._4_4_;
  auVar97._8_4_ = auVar74._8_4_ * auVar84._8_4_;
  auVar97._12_4_ = auVar74._12_4_ * auVar84._12_4_;
  auVar97._16_4_ = auVar84._16_4_ * 0.0;
  auVar97._20_4_ = auVar84._20_4_ * 0.0;
  auVar97._24_4_ = auVar84._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar84 = vpminsd_avx2(auVar90,auVar99);
  auVar85 = vpminsd_avx2(auVar91,auVar98);
  auVar84 = vmaxps_avx(auVar84,auVar85);
  auVar85 = vpminsd_avx2(auVar92,auVar97);
  uVar229 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar86._4_4_ = uVar229;
  auVar86._0_4_ = uVar229;
  auVar86._8_4_ = uVar229;
  auVar86._12_4_ = uVar229;
  auVar86._16_4_ = uVar229;
  auVar86._20_4_ = uVar229;
  auVar86._24_4_ = uVar229;
  auVar86._28_4_ = uVar229;
  auVar85 = vmaxps_avx512vl(auVar85,auVar86);
  auVar84 = vmaxps_avx(auVar84,auVar85);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  auVar85._16_4_ = 0x3f7ffffa;
  auVar85._20_4_ = 0x3f7ffffa;
  auVar85._24_4_ = 0x3f7ffffa;
  auVar85._28_4_ = 0x3f7ffffa;
  local_560 = vmulps_avx512vl(auVar84,auVar85);
  auVar84 = vpmaxsd_avx2(auVar90,auVar99);
  auVar85 = vpmaxsd_avx2(auVar91,auVar98);
  auVar84 = vminps_avx(auVar84,auVar85);
  auVar85 = vpmaxsd_avx2(auVar92,auVar97);
  uVar229 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar87._4_4_ = uVar229;
  auVar87._0_4_ = uVar229;
  auVar87._8_4_ = uVar229;
  auVar87._12_4_ = uVar229;
  auVar87._16_4_ = uVar229;
  auVar87._20_4_ = uVar229;
  auVar87._24_4_ = uVar229;
  auVar87._28_4_ = uVar229;
  auVar85 = vminps_avx512vl(auVar85,auVar87);
  auVar84 = vminps_avx(auVar84,auVar85);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar88);
  auVar85 = vpbroadcastd_avx512vl();
  uVar21 = vpcmpgtd_avx512vl(auVar85,_DAT_0205a920);
  uVar19 = vcmpps_avx512vl(local_560,auVar84,2);
  bVar69 = (byte)((byte)uVar19 & (byte)uVar21) == 0;
  local_c41 = !bVar69;
  if (bVar69) {
    return local_c41;
  }
  local_808 = (ulong)(byte)((byte)uVar19 & (byte)uVar21);
  auVar165 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar165);
LAB_01edda0a:
  lVar67 = 0;
  for (uVar59 = local_808; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  uVar58 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar58].ptr;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(prim + lVar67 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar230 = (pGVar4->time_range).lower;
  fVar230 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar230) / ((pGVar4->time_range).upper - fVar230));
  auVar72 = vroundss_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),9);
  auVar72 = vminss_avx(auVar72,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar72 = vmaxss_avx(ZEXT816(0) << 0x20,auVar72);
  fVar230 = fVar230 - auVar72._0_4_;
  fVar148 = 1.0 - fVar230;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar60 = (long)(int)auVar72._0_4_ * 0x38;
  lVar6 = *(long *)(_Var5 + 0x10 + lVar60);
  lVar7 = *(long *)(_Var5 + 0x38 + lVar60);
  lVar8 = *(long *)(_Var5 + 0x48 + lVar60);
  pfVar1 = (float *)(lVar7 + lVar8 * uVar59);
  auVar80._0_4_ = fVar230 * *pfVar1;
  auVar80._4_4_ = fVar230 * pfVar1[1];
  auVar80._8_4_ = fVar230 * pfVar1[2];
  auVar80._12_4_ = fVar230 * pfVar1[3];
  lVar67 = uVar59 + 1;
  pfVar1 = (float *)(lVar7 + lVar8 * lVar67);
  auVar168._0_4_ = fVar230 * *pfVar1;
  auVar168._4_4_ = fVar230 * pfVar1[1];
  auVar168._8_4_ = fVar230 * pfVar1[2];
  auVar168._12_4_ = fVar230 * pfVar1[3];
  p_Var9 = pGVar4[4].occlusionFilterN;
  auVar216._4_4_ = fVar148;
  auVar216._0_4_ = fVar148;
  auVar216._8_4_ = fVar148;
  auVar216._12_4_ = fVar148;
  auVar75 = vfmadd231ps_fma(auVar80,auVar216,
                            *(undefined1 (*) [16])(*(long *)(_Var5 + lVar60) + lVar6 * uVar59));
  auVar76 = vfmadd231ps_fma(auVar168,auVar216,
                            *(undefined1 (*) [16])(*(long *)(_Var5 + lVar60) + lVar6 * lVar67));
  pfVar1 = (float *)(*(long *)(p_Var9 + lVar60 + 0x38) + uVar59 * *(long *)(p_Var9 + lVar60 + 0x48))
  ;
  auVar188._0_4_ = fVar230 * *pfVar1;
  auVar188._4_4_ = fVar230 * pfVar1[1];
  auVar188._8_4_ = fVar230 * pfVar1[2];
  auVar188._12_4_ = fVar230 * pfVar1[3];
  pfVar1 = (float *)(*(long *)(p_Var9 + lVar60 + 0x38) + *(long *)(p_Var9 + lVar60 + 0x48) * lVar67)
  ;
  auVar209._0_4_ = fVar230 * *pfVar1;
  auVar209._4_4_ = fVar230 * pfVar1[1];
  auVar209._8_4_ = fVar230 * pfVar1[2];
  auVar209._12_4_ = fVar230 * pfVar1[3];
  auVar74 = vfmadd231ps_fma(auVar188,auVar216,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var9 + lVar60) +
                             *(long *)(p_Var9 + lVar60 + 0x10) * uVar59));
  auVar77 = vfmadd231ps_fma(auVar209,auVar216,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var9 + lVar60) +
                             *(long *)(p_Var9 + lVar60 + 0x10) * lVar67));
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar17 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar229 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar248._4_4_ = uVar229;
  auVar248._0_4_ = uVar229;
  auVar248._8_4_ = uVar229;
  auVar248._12_4_ = uVar229;
  local_720._16_4_ = uVar229;
  local_720._0_16_ = auVar248;
  local_720._20_4_ = uVar229;
  local_720._24_4_ = uVar229;
  local_720._28_4_ = uVar229;
  auVar85 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar72 = vunpcklps_avx512vl(auVar248,auVar85._0_16_);
  fVar230 = *(float *)(ray + k * 4 + 0x180);
  auVar254._4_4_ = fVar230;
  auVar254._0_4_ = fVar230;
  auVar254._8_4_ = fVar230;
  auVar254._12_4_ = fVar230;
  local_700._16_4_ = fVar230;
  local_700._0_16_ = auVar254;
  local_700._20_4_ = fVar230;
  local_700._24_4_ = fVar230;
  local_700._28_4_ = fVar230;
  local_8f0 = vinsertps_avx(auVar72,auVar254,0x28);
  auVar224._8_4_ = 0xbeaaaaab;
  auVar224._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar224._12_4_ = 0xbeaaaaab;
  auVar2 = vfnmadd213ps_fma(auVar74,auVar224,auVar75);
  auVar74 = vfmadd213ps_fma(auVar77,auVar224,auVar76);
  auVar225._0_4_ = auVar76._0_4_ + auVar75._0_4_ + auVar2._0_4_ + auVar74._0_4_;
  auVar225._4_4_ = auVar76._4_4_ + auVar75._4_4_ + auVar2._4_4_ + auVar74._4_4_;
  auVar225._8_4_ = auVar76._8_4_ + auVar75._8_4_ + auVar2._8_4_ + auVar74._8_4_;
  auVar225._12_4_ = auVar76._12_4_ + auVar75._12_4_ + auVar2._12_4_ + auVar74._12_4_;
  auVar79._8_4_ = 0x3e800000;
  auVar79._0_8_ = 0x3e8000003e800000;
  auVar79._12_4_ = 0x3e800000;
  auVar72 = vmulps_avx512vl(auVar225,auVar79);
  auVar72 = vsubps_avx(auVar72,auVar17);
  auVar72 = vdpps_avx(auVar72,local_8f0,0x7f);
  fVar148 = *(float *)(ray + k * 4 + 0xc0);
  local_900 = vdpps_avx(local_8f0,local_8f0,0x7f);
  auVar165 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar165);
  auVar231._4_12_ = ZEXT812(0) << 0x20;
  auVar231._0_4_ = local_900._0_4_;
  auVar73 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar231);
  auVar77 = vfnmadd213ss_fma(auVar73,local_900,ZEXT416(0x40000000));
  local_540 = auVar72._0_4_ * auVar73._0_4_ * auVar77._0_4_;
  auVar232._4_4_ = local_540;
  auVar232._0_4_ = local_540;
  auVar232._8_4_ = local_540;
  auVar232._12_4_ = local_540;
  fStack_6d0 = local_540;
  _local_6e0 = auVar232;
  fStack_6cc = local_540;
  fStack_6c8 = local_540;
  fStack_6c4 = local_540;
  auVar72 = vfmadd231ps_fma(auVar17,local_8f0,auVar232);
  auVar72 = vblendps_avx(auVar72,ZEXT816(0) << 0x40,8);
  auVar17 = vsubps_avx(auVar75,auVar72);
  auVar74 = vsubps_avx(auVar74,auVar72);
  auVar75 = vsubps_avx(auVar2,auVar72);
  auVar72 = vsubps_avx(auVar76,auVar72);
  uVar229 = auVar17._0_4_;
  local_8e0._4_4_ = uVar229;
  local_8e0._0_4_ = uVar229;
  local_8e0._8_4_ = uVar229;
  local_8e0._12_4_ = uVar229;
  local_8e0._16_4_ = uVar229;
  local_8e0._20_4_ = uVar229;
  local_8e0._24_4_ = uVar229;
  local_8e0._28_4_ = uVar229;
  auVar244 = ZEXT3264(local_8e0);
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  local_780 = ZEXT1632(auVar17);
  auVar84 = vpermps_avx2(auVar106,local_780);
  auVar107._8_4_ = 2;
  auVar107._0_8_ = 0x200000002;
  auVar107._12_4_ = 2;
  auVar107._16_4_ = 2;
  auVar107._20_4_ = 2;
  auVar107._24_4_ = 2;
  auVar107._28_4_ = 2;
  auVar86 = vpermps_avx512vl(auVar107,local_780);
  auVar108._8_4_ = 3;
  auVar108._0_8_ = 0x300000003;
  auVar108._12_4_ = 3;
  auVar108._16_4_ = 3;
  auVar108._20_4_ = 3;
  auVar108._24_4_ = 3;
  auVar108._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar108,local_780);
  uVar229 = auVar75._0_4_;
  local_800._4_4_ = uVar229;
  local_800._0_4_ = uVar229;
  local_800._8_4_ = uVar229;
  local_800._12_4_ = uVar229;
  local_800._16_4_ = uVar229;
  local_800._20_4_ = uVar229;
  local_800._24_4_ = uVar229;
  local_800._28_4_ = uVar229;
  local_7c0 = ZEXT1632(auVar75);
  local_940 = vpermps_avx2(auVar106,local_7c0);
  auVar88 = vpermps_avx512vl(auVar107,local_7c0);
  auVar89 = vpermps_avx512vl(auVar108,local_7c0);
  auVar90 = vbroadcastss_avx512vl(auVar74);
  local_7a0 = ZEXT1632(auVar74);
  auVar91 = vpermps_avx512vl(auVar106,local_7a0);
  auVar92 = vpermps_avx512vl(auVar107,local_7a0);
  auVar93 = vpermps_avx512vl(auVar108,local_7a0);
  auVar83 = vbroadcastss_avx512vl(auVar72);
  _local_7e0 = ZEXT1632(auVar72);
  auVar94 = vpermps_avx512vl(auVar106,_local_7e0);
  auVar95 = vpermps_avx512vl(auVar107,_local_7e0);
  auVar81 = vpermps_avx512vl(auVar108,_local_7e0);
  auVar223 = ZEXT3264(local_940);
  auVar165 = ZEXT3264(local_800);
  local_5e0 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar230 * fVar230)),auVar85,auVar85);
  auVar72 = vfmadd231ps_fma(local_5e0,local_720,local_720);
  local_520._0_4_ = auVar72._0_4_;
  local_520._4_4_ = local_520._0_4_;
  local_520._8_4_ = local_520._0_4_;
  local_520._12_4_ = local_520._0_4_;
  local_520._16_4_ = local_520._0_4_;
  local_520._20_4_ = local_520._0_4_;
  local_520._24_4_ = local_520._0_4_;
  local_520._28_4_ = local_520._0_4_;
  vandps_avx512vl(local_520,auVar255._0_32_);
  local_870 = ZEXT416((uint)local_540);
  local_540 = fVar148 - local_540;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  uVar59 = 0;
  bVar65 = 0;
  iVar62 = 1;
  auVar255 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar255);
  auVar72 = vsqrtss_avx(local_900,local_900);
  auVar17 = vsqrtss_avx(local_900,local_900);
  local_890 = ZEXT816(0x3f80000000000000);
  auVar215 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar74 = vmovshdup_avx(local_890);
    auVar228._0_4_ = local_890._0_4_;
    fVar230 = auVar74._0_4_ - auVar228._0_4_;
    fVar246 = fVar230 * 0.04761905;
    auVar228._4_4_ = auVar228._0_4_;
    auVar228._8_4_ = auVar228._0_4_;
    auVar228._12_4_ = auVar228._0_4_;
    auVar228._16_4_ = auVar228._0_4_;
    auVar228._20_4_ = auVar228._0_4_;
    auVar228._24_4_ = auVar228._0_4_;
    auVar228._28_4_ = auVar228._0_4_;
    local_920._4_4_ = fVar230;
    local_920._0_4_ = fVar230;
    local_920._8_4_ = fVar230;
    local_920._12_4_ = fVar230;
    local_920._16_4_ = fVar230;
    local_920._20_4_ = fVar230;
    local_920._24_4_ = fVar230;
    local_920._28_4_ = fVar230;
    auVar74 = vfmadd231ps_fma(auVar228,local_920,_DAT_02020f20);
    auVar122 = auVar215._0_32_;
    auVar82 = vsubps_avx(auVar122,ZEXT1632(auVar74));
    fVar230 = auVar74._0_4_;
    auVar128._0_4_ = auVar165._0_4_ * fVar230;
    fVar237 = auVar74._4_4_;
    auVar128._4_4_ = auVar165._4_4_ * fVar237;
    fVar238 = auVar74._8_4_;
    auVar128._8_4_ = auVar165._8_4_ * fVar238;
    fVar239 = auVar74._12_4_;
    auVar128._12_4_ = auVar165._12_4_ * fVar239;
    auVar128._16_4_ = auVar165._16_4_ * 0.0;
    auVar128._20_4_ = auVar165._20_4_ * 0.0;
    auVar128._24_4_ = auVar165._24_4_ * 0.0;
    auVar128._28_4_ = 0;
    auVar98 = ZEXT1632(auVar74);
    auVar255._0_4_ = auVar223._0_4_ * fVar230;
    auVar255._4_4_ = auVar223._4_4_ * fVar237;
    auVar255._8_4_ = auVar223._8_4_ * fVar238;
    auVar255._12_4_ = auVar223._12_4_ * fVar239;
    auVar255._16_4_ = auVar223._16_4_ * 0.0;
    auVar255._20_4_ = auVar223._20_4_ * 0.0;
    auVar255._28_36_ = auVar165._28_36_;
    auVar255._24_4_ = auVar223._24_4_ * 0.0;
    auVar96 = vmulps_avx512vl(auVar88,auVar98);
    auVar97 = vmulps_avx512vl(auVar89,auVar98);
    auVar75 = vfmadd231ps_fma(auVar128,auVar82,auVar244._0_32_);
    auVar76 = vfmadd231ps_fma(auVar255._0_32_,auVar82,auVar84);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar82,auVar86);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar82,auVar87);
    auVar98 = vmulps_avx512vl(auVar90,auVar98);
    auVar104 = ZEXT1632(auVar74);
    auVar99 = vmulps_avx512vl(auVar91,auVar104);
    auVar100 = vmulps_avx512vl(auVar92,auVar104);
    auVar101 = vmulps_avx512vl(auVar93,auVar104);
    auVar77 = vfmadd231ps_fma(auVar98,auVar82,auVar165._0_32_);
    auVar2 = vfmadd231ps_fma(auVar99,auVar82,auVar223._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar100,auVar82,auVar88);
    auVar99 = vfmadd231ps_avx512vl(auVar101,auVar82,auVar89);
    auVar100 = vmulps_avx512vl(auVar83,auVar104);
    auVar101 = vmulps_avx512vl(auVar94,auVar104);
    auVar102 = vmulps_avx512vl(auVar95,auVar104);
    auVar103 = vmulps_avx512vl(auVar81,auVar104);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar82,auVar90);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar82,auVar91);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar82,auVar92);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar82,auVar93);
    auVar104 = vmulps_avx512vl(auVar104,ZEXT1632(auVar77));
    auVar108 = ZEXT1632(auVar74);
    auVar105 = vmulps_avx512vl(auVar108,ZEXT1632(auVar2));
    auVar106 = vmulps_avx512vl(auVar108,auVar98);
    auVar107 = vmulps_avx512vl(auVar108,auVar99);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar82,ZEXT1632(auVar75));
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar82,ZEXT1632(auVar76));
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar82,auVar96);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar82,auVar97);
    auVar124._0_4_ = auVar100._0_4_ * fVar230;
    auVar124._4_4_ = auVar100._4_4_ * fVar237;
    auVar124._8_4_ = auVar100._8_4_ * fVar238;
    auVar124._12_4_ = auVar100._12_4_ * fVar239;
    auVar124._16_4_ = auVar100._16_4_ * 0.0;
    auVar124._20_4_ = auVar100._20_4_ * 0.0;
    auVar124._24_4_ = auVar100._24_4_ * 0.0;
    auVar124._28_4_ = 0;
    auVar109._4_4_ = auVar101._4_4_ * fVar237;
    auVar109._0_4_ = auVar101._0_4_ * fVar230;
    auVar109._8_4_ = auVar101._8_4_ * fVar238;
    auVar109._12_4_ = auVar101._12_4_ * fVar239;
    auVar109._16_4_ = auVar101._16_4_ * 0.0;
    auVar109._20_4_ = auVar101._20_4_ * 0.0;
    auVar109._24_4_ = auVar101._24_4_ * 0.0;
    auVar109._28_4_ = auVar100._28_4_;
    auVar115._4_4_ = auVar102._4_4_ * fVar237;
    auVar115._0_4_ = auVar102._0_4_ * fVar230;
    auVar115._8_4_ = auVar102._8_4_ * fVar238;
    auVar115._12_4_ = auVar102._12_4_ * fVar239;
    auVar115._16_4_ = auVar102._16_4_ * 0.0;
    auVar115._20_4_ = auVar102._20_4_ * 0.0;
    auVar115._24_4_ = auVar102._24_4_ * 0.0;
    auVar115._28_4_ = auVar101._28_4_;
    auVar116._4_4_ = auVar103._4_4_ * fVar237;
    auVar116._0_4_ = auVar103._0_4_ * fVar230;
    auVar116._8_4_ = auVar103._8_4_ * fVar238;
    auVar116._12_4_ = auVar103._12_4_ * fVar239;
    auVar116._16_4_ = auVar103._16_4_ * 0.0;
    auVar116._20_4_ = auVar103._20_4_ * 0.0;
    auVar116._24_4_ = auVar103._24_4_ * 0.0;
    auVar116._28_4_ = auVar102._28_4_;
    auVar74 = vfmadd231ps_fma(auVar124,auVar82,ZEXT1632(auVar77));
    auVar75 = vfmadd231ps_fma(auVar109,auVar82,ZEXT1632(auVar2));
    auVar76 = vfmadd231ps_fma(auVar115,auVar82,auVar98);
    auVar77 = vfmadd231ps_fma(auVar116,auVar82,auVar99);
    auVar117._28_4_ = auVar97._28_4_;
    auVar117._0_28_ =
         ZEXT1628(CONCAT412(fVar239 * auVar74._12_4_,
                            CONCAT48(fVar238 * auVar74._8_4_,
                                     CONCAT44(fVar237 * auVar74._4_4_,fVar230 * auVar74._0_4_))));
    auVar118._28_4_ = auVar96._28_4_;
    auVar118._0_28_ =
         ZEXT1628(CONCAT412(auVar75._12_4_ * fVar239,
                            CONCAT48(auVar75._8_4_ * fVar238,
                                     CONCAT44(auVar75._4_4_ * fVar237,auVar75._0_4_ * fVar230))));
    auVar96 = vmulps_avx512vl(auVar108,ZEXT1632(auVar76));
    auVar100 = vfmadd231ps_avx512vl(auVar117,auVar82,auVar104);
    auVar101 = vfmadd231ps_avx512vl(auVar118,auVar82,auVar105);
    local_8c0 = vfmadd231ps_avx512vl(auVar96,auVar82,auVar106);
    auVar97 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar239,
                                            CONCAT48(auVar77._8_4_ * fVar238,
                                                     CONCAT44(auVar77._4_4_ * fVar237,
                                                              auVar77._0_4_ * fVar230)))),auVar107,
                         auVar82);
    auVar82 = vsubps_avx512vl(ZEXT1632(auVar74),auVar104);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar75),auVar105);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar76),auVar106);
    auVar102 = vsubps_avx512vl(ZEXT1632(auVar77),auVar107);
    auVar125._4_4_ = fVar246 * auVar82._4_4_ * 3.0;
    auVar125._0_4_ = fVar246 * auVar82._0_4_ * 3.0;
    auVar125._8_4_ = fVar246 * auVar82._8_4_ * 3.0;
    auVar125._12_4_ = fVar246 * auVar82._12_4_ * 3.0;
    auVar125._16_4_ = fVar246 * auVar82._16_4_ * 3.0;
    auVar125._20_4_ = fVar246 * auVar82._20_4_ * 3.0;
    auVar125._24_4_ = fVar246 * auVar82._24_4_ * 3.0;
    auVar125._28_4_ = auVar99._28_4_;
    auVar249._0_4_ = fVar246 * auVar96._0_4_ * 3.0;
    auVar249._4_4_ = fVar246 * auVar96._4_4_ * 3.0;
    auVar249._8_4_ = fVar246 * auVar96._8_4_ * 3.0;
    auVar249._12_4_ = fVar246 * auVar96._12_4_ * 3.0;
    auVar249._16_4_ = fVar246 * auVar96._16_4_ * 3.0;
    auVar249._20_4_ = fVar246 * auVar96._20_4_ * 3.0;
    auVar249._24_4_ = fVar246 * auVar96._24_4_ * 3.0;
    auVar249._28_4_ = 0;
    auVar252._0_4_ = auVar98._0_4_ * 3.0 * fVar246;
    auVar252._4_4_ = auVar98._4_4_ * 3.0 * fVar246;
    auVar252._8_4_ = auVar98._8_4_ * 3.0 * fVar246;
    auVar252._12_4_ = auVar98._12_4_ * 3.0 * fVar246;
    auVar252._16_4_ = auVar98._16_4_ * 3.0 * fVar246;
    auVar252._20_4_ = auVar98._20_4_ * 3.0 * fVar246;
    auVar252._24_4_ = auVar98._24_4_ * 3.0 * fVar246;
    auVar252._28_4_ = 0;
    fVar230 = auVar102._0_4_ * 3.0 * fVar246;
    fVar237 = auVar102._4_4_ * 3.0 * fVar246;
    auVar119._4_4_ = fVar237;
    auVar119._0_4_ = fVar230;
    fVar238 = auVar102._8_4_ * 3.0 * fVar246;
    auVar119._8_4_ = fVar238;
    fVar239 = auVar102._12_4_ * 3.0 * fVar246;
    auVar119._12_4_ = fVar239;
    fVar240 = auVar102._16_4_ * 3.0 * fVar246;
    auVar119._16_4_ = fVar240;
    fVar241 = auVar102._20_4_ * 3.0 * fVar246;
    auVar119._20_4_ = fVar241;
    fVar242 = auVar102._24_4_ * 3.0 * fVar246;
    auVar119._24_4_ = fVar242;
    auVar119._28_4_ = fVar246;
    auVar74 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar99 = vpermt2ps_avx512vl(auVar100,_DAT_0205fd20,ZEXT1632(auVar74));
    auVar102 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,ZEXT1632(auVar74));
    auVar98 = ZEXT1632(auVar74);
    auVar103 = vpermt2ps_avx512vl(local_8c0,_DAT_0205fd20,auVar98);
    auVar181._0_4_ = auVar97._0_4_ + fVar230;
    auVar181._4_4_ = auVar97._4_4_ + fVar237;
    auVar181._8_4_ = auVar97._8_4_ + fVar238;
    auVar181._12_4_ = auVar97._12_4_ + fVar239;
    auVar181._16_4_ = auVar97._16_4_ + fVar240;
    auVar181._20_4_ = auVar97._20_4_ + fVar241;
    auVar181._24_4_ = auVar97._24_4_ + fVar242;
    auVar181._28_4_ = auVar97._28_4_ + fVar246;
    auVar82 = vmaxps_avx(auVar97,auVar181);
    auVar96 = vminps_avx(auVar97,auVar181);
    auVar104 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar98);
    auVar105 = vpermt2ps_avx512vl(auVar125,_DAT_0205fd20,auVar98);
    auVar106 = vpermt2ps_avx512vl(auVar249,_DAT_0205fd20,auVar98);
    auVar128 = ZEXT1632(auVar74);
    auVar107 = vpermt2ps_avx512vl(auVar252,_DAT_0205fd20,auVar128);
    auVar97 = vpermt2ps_avx512vl(auVar119,_DAT_0205fd20,auVar128);
    auVar108 = vsubps_avx512vl(auVar104,auVar97);
    auVar97 = vsubps_avx(auVar99,auVar100);
    auVar98 = vsubps_avx(auVar102,auVar101);
    auVar109 = vsubps_avx512vl(auVar103,local_8c0);
    auVar110 = vmulps_avx512vl(auVar98,auVar252);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar249,auVar109);
    auVar111 = vmulps_avx512vl(auVar109,auVar125);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar252,auVar97);
    auVar112 = vmulps_avx512vl(auVar97,auVar249);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar125,auVar98);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar98,auVar98);
    auVar113 = vfmadd231ps_avx512vl(auVar111,auVar97,auVar97);
    auVar111 = vrcp14ps_avx512vl(auVar113);
    auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar113,auVar122);
    auVar111 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vmulps_avx512vl(auVar110,auVar111);
    auVar112 = vmulps_avx512vl(auVar98,auVar107);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar106,auVar109);
    auVar114 = vmulps_avx512vl(auVar109,auVar105);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar107,auVar97);
    auVar115 = vmulps_avx512vl(auVar97,auVar106);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar105,auVar98);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar112 = vfmadd231ps_avx512vl(auVar114,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar110 = vmaxps_avx512vl(auVar110,auVar111);
    auVar110 = vsqrtps_avx512vl(auVar110);
    auVar111 = vmaxps_avx512vl(auVar108,auVar104);
    auVar82 = vmaxps_avx512vl(auVar82,auVar111);
    auVar111 = vaddps_avx512vl(auVar110,auVar82);
    auVar82 = vminps_avx512vl(auVar108,auVar104);
    auVar82 = vminps_avx(auVar96,auVar82);
    auVar82 = vsubps_avx512vl(auVar82,auVar110);
    auVar110._8_4_ = 0x3f800002;
    auVar110._0_8_ = 0x3f8000023f800002;
    auVar110._12_4_ = 0x3f800002;
    auVar110._16_4_ = 0x3f800002;
    auVar110._20_4_ = 0x3f800002;
    auVar110._24_4_ = 0x3f800002;
    auVar110._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar111,auVar110);
    auVar111._8_4_ = 0x3f7ffffc;
    auVar111._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar111._12_4_ = 0x3f7ffffc;
    auVar111._16_4_ = 0x3f7ffffc;
    auVar111._20_4_ = 0x3f7ffffc;
    auVar111._24_4_ = 0x3f7ffffc;
    auVar111._28_4_ = 0x3f7ffffc;
    auVar82 = vmulps_avx512vl(auVar82,auVar111);
    auVar120._4_4_ = auVar96._4_4_ * auVar96._4_4_;
    auVar120._0_4_ = auVar96._0_4_ * auVar96._0_4_;
    auVar120._8_4_ = auVar96._8_4_ * auVar96._8_4_;
    auVar120._12_4_ = auVar96._12_4_ * auVar96._12_4_;
    auVar120._16_4_ = auVar96._16_4_ * auVar96._16_4_;
    auVar120._20_4_ = auVar96._20_4_ * auVar96._20_4_;
    auVar120._24_4_ = auVar96._24_4_ * auVar96._24_4_;
    auVar120._28_4_ = auVar82._28_4_;
    auVar96 = vrsqrt14ps_avx512vl(auVar113);
    auVar112._8_4_ = 0xbf000000;
    auVar112._0_8_ = 0xbf000000bf000000;
    auVar112._12_4_ = 0xbf000000;
    auVar112._16_4_ = 0xbf000000;
    auVar112._20_4_ = 0xbf000000;
    auVar112._24_4_ = 0xbf000000;
    auVar112._28_4_ = 0xbf000000;
    auVar104 = vmulps_avx512vl(auVar113,auVar112);
    auVar121._4_4_ = auVar96._4_4_ * auVar104._4_4_;
    auVar121._0_4_ = auVar96._0_4_ * auVar104._0_4_;
    auVar121._8_4_ = auVar96._8_4_ * auVar104._8_4_;
    auVar121._12_4_ = auVar96._12_4_ * auVar104._12_4_;
    auVar121._16_4_ = auVar96._16_4_ * auVar104._16_4_;
    auVar121._20_4_ = auVar96._20_4_ * auVar104._20_4_;
    auVar121._24_4_ = auVar96._24_4_ * auVar104._24_4_;
    auVar121._28_4_ = auVar104._28_4_;
    auVar104 = vmulps_avx512vl(auVar96,auVar96);
    auVar104 = vmulps_avx512vl(auVar104,auVar121);
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,auVar113);
    auVar127._4_4_ = auVar104._4_4_ * auVar97._4_4_;
    auVar127._0_4_ = auVar104._0_4_ * auVar97._0_4_;
    auVar127._8_4_ = auVar104._8_4_ * auVar97._8_4_;
    auVar127._12_4_ = auVar104._12_4_ * auVar97._12_4_;
    auVar127._16_4_ = auVar104._16_4_ * auVar97._16_4_;
    auVar127._20_4_ = auVar104._20_4_ * auVar97._20_4_;
    auVar127._24_4_ = auVar104._24_4_ * auVar97._24_4_;
    auVar127._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar104);
    auVar108 = vmulps_avx512vl(auVar109,auVar104);
    auVar110 = vsubps_avx512vl(auVar128,auVar100);
    auVar111 = vsubps_avx512vl(auVar128,auVar101);
    auVar112 = vsubps_avx512vl(auVar128,local_8c0);
    auVar113 = vmulps_avx512vl(local_700,auVar112);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar85,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_720,auVar110);
    auVar114 = vmulps_avx512vl(auVar112,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar115 = vmulps_avx512vl(local_700,auVar108);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar96,auVar85);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar127,local_720);
    auVar108 = vmulps_avx512vl(auVar112,auVar108);
    auVar96 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar110,auVar127);
    local_740 = vmulps_avx512vl(auVar115,auVar115);
    auVar108 = vsubps_avx512vl(local_520,local_740);
    auVar116 = vmulps_avx512vl(auVar115,auVar96);
    auVar113 = vsubps_avx512vl(auVar113,auVar116);
    auVar113 = vaddps_avx512vl(auVar113,auVar113);
    auVar116 = vmulps_avx512vl(auVar96,auVar96);
    auVar116 = vsubps_avx512vl(auVar114,auVar116);
    auVar117 = vsubps_avx512vl(auVar116,auVar120);
    auVar118 = vmulps_avx512vl(auVar113,auVar113);
    auVar114._8_4_ = 0x40800000;
    auVar114._0_8_ = 0x4080000040800000;
    auVar114._12_4_ = 0x40800000;
    auVar114._16_4_ = 0x40800000;
    auVar114._20_4_ = 0x40800000;
    auVar114._24_4_ = 0x40800000;
    auVar114._28_4_ = 0x40800000;
    auVar114 = vmulps_avx512vl(auVar108,auVar114);
    auVar119 = vmulps_avx512vl(auVar114,auVar117);
    auVar119 = vsubps_avx512vl(auVar118,auVar119);
    uVar71 = vcmpps_avx512vl(auVar119,auVar128,5);
    bVar54 = (byte)uVar71;
    if (bVar54 == 0) {
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar119 = vsqrtps_avx512vl(auVar119);
      auVar120 = vaddps_avx512vl(auVar108,auVar108);
      auVar121 = vrcp14ps_avx512vl(auVar120);
      auVar120 = vfnmadd213ps_avx512vl(auVar120,auVar121,auVar122);
      auVar120 = vfmadd132ps_avx512vl(auVar120,auVar121,auVar121);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar121 = vxorps_avx512vl(auVar113,auVar29);
      auVar121 = vsubps_avx512vl(auVar121,auVar119);
      auVar121 = vmulps_avx512vl(auVar121,auVar120);
      auVar119 = vsubps_avx512vl(auVar119,auVar113);
      auVar119 = vmulps_avx512vl(auVar119,auVar120);
      auVar120 = vfmadd213ps_avx512vl(auVar115,auVar121,auVar96);
      local_620 = vmulps_avx512vl(auVar104,auVar120);
      auVar120 = vfmadd213ps_avx512vl(auVar115,auVar119,auVar96);
      local_640 = vmulps_avx512vl(auVar104,auVar120);
      auVar155._8_4_ = 0x7f800000;
      auVar155._0_8_ = 0x7f8000007f800000;
      auVar155._12_4_ = 0x7f800000;
      auVar155._16_4_ = 0x7f800000;
      auVar155._20_4_ = 0x7f800000;
      auVar155._24_4_ = 0x7f800000;
      auVar155._28_4_ = 0x7f800000;
      auVar120 = vblendmps_avx512vl(auVar155,auVar121);
      auVar122._0_4_ =
           (uint)(bVar54 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar54 & 1) * local_640._0_4_;
      bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar69 * auVar120._4_4_ | (uint)!bVar69 * local_640._4_4_;
      bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar69 * auVar120._8_4_ | (uint)!bVar69 * local_640._8_4_;
      bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar69 * auVar120._12_4_ | (uint)!bVar69 * local_640._12_4_;
      bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar69 * auVar120._16_4_ | (uint)!bVar69 * local_640._16_4_;
      bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar69 * auVar120._20_4_ | (uint)!bVar69 * local_640._20_4_;
      bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar69 * auVar120._24_4_ | (uint)!bVar69 * local_640._24_4_;
      bVar69 = SUB81(uVar71 >> 7,0);
      auVar122._28_4_ = (uint)bVar69 * auVar120._28_4_ | (uint)!bVar69 * local_640._28_4_;
      auVar156._8_4_ = 0xff800000;
      auVar156._0_8_ = 0xff800000ff800000;
      auVar156._12_4_ = 0xff800000;
      auVar156._16_4_ = 0xff800000;
      auVar156._20_4_ = 0xff800000;
      auVar156._24_4_ = 0xff800000;
      auVar156._28_4_ = 0xff800000;
      auVar120 = vblendmps_avx512vl(auVar156,auVar119);
      auVar123._0_4_ =
           (uint)(bVar54 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar119._0_4_;
      bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar69 * auVar120._4_4_ | (uint)!bVar69 * auVar119._4_4_;
      bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar69 * auVar120._8_4_ | (uint)!bVar69 * auVar119._8_4_;
      bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar69 * auVar120._12_4_ | (uint)!bVar69 * auVar119._12_4_;
      bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar69 * auVar120._16_4_ | (uint)!bVar69 * auVar119._16_4_;
      bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar69 * auVar120._20_4_ | (uint)!bVar69 * auVar119._20_4_;
      bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar69 * auVar120._24_4_ | (uint)!bVar69 * auVar119._24_4_;
      bVar69 = SUB81(uVar71 >> 7,0);
      auVar123._28_4_ = (uint)bVar69 * auVar120._28_4_ | (uint)!bVar69 * auVar119._28_4_;
      auVar157._8_4_ = 0x7fffffff;
      auVar157._0_8_ = 0x7fffffff7fffffff;
      auVar157._12_4_ = 0x7fffffff;
      auVar157._16_4_ = 0x7fffffff;
      auVar157._20_4_ = 0x7fffffff;
      auVar157._24_4_ = 0x7fffffff;
      auVar157._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_740,auVar157);
      auVar119 = vmaxps_avx512vl(local_5e0,local_740);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      auVar120 = vmulps_avx512vl(auVar119,auVar30);
      auVar119 = vandps_avx(auVar108,auVar157);
      uVar61 = vcmpps_avx512vl(auVar119,auVar120,1);
      uVar71 = uVar71 & uVar61;
      bVar64 = (byte)uVar71;
      if (bVar64 != 0) {
        uVar61 = vcmpps_avx512vl(auVar117,_DAT_02020f00,2);
        auVar187._8_4_ = 0xff800000;
        auVar187._0_8_ = 0xff800000ff800000;
        auVar187._12_4_ = 0xff800000;
        auVar187._16_4_ = 0xff800000;
        auVar187._20_4_ = 0xff800000;
        auVar187._24_4_ = 0xff800000;
        auVar187._28_4_ = 0xff800000;
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar120 = vblendmps_avx512vl(auVar117,auVar187);
        bVar57 = (byte)uVar61;
        uVar56 = (uint)(bVar57 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar119._0_4_;
        bVar69 = (bool)((byte)(uVar61 >> 1) & 1);
        uVar141 = (uint)bVar69 * auVar120._4_4_ | (uint)!bVar69 * auVar119._4_4_;
        bVar69 = (bool)((byte)(uVar61 >> 2) & 1);
        uVar142 = (uint)bVar69 * auVar120._8_4_ | (uint)!bVar69 * auVar119._8_4_;
        bVar69 = (bool)((byte)(uVar61 >> 3) & 1);
        uVar143 = (uint)bVar69 * auVar120._12_4_ | (uint)!bVar69 * auVar119._12_4_;
        bVar69 = (bool)((byte)(uVar61 >> 4) & 1);
        uVar144 = (uint)bVar69 * auVar120._16_4_ | (uint)!bVar69 * auVar119._16_4_;
        bVar69 = (bool)((byte)(uVar61 >> 5) & 1);
        uVar145 = (uint)bVar69 * auVar120._20_4_ | (uint)!bVar69 * auVar119._20_4_;
        bVar69 = (bool)((byte)(uVar61 >> 6) & 1);
        uVar146 = (uint)bVar69 * auVar120._24_4_ | (uint)!bVar69 * auVar119._24_4_;
        bVar69 = SUB81(uVar61 >> 7,0);
        uVar147 = (uint)bVar69 * auVar120._28_4_ | (uint)!bVar69 * auVar119._28_4_;
        auVar122._0_4_ = (bVar64 & 1) * uVar56 | !(bool)(bVar64 & 1) * auVar122._0_4_;
        bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar122._4_4_ = bVar69 * uVar141 | !bVar69 * auVar122._4_4_;
        bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar122._8_4_ = bVar69 * uVar142 | !bVar69 * auVar122._8_4_;
        bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar122._12_4_ = bVar69 * uVar143 | !bVar69 * auVar122._12_4_;
        bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar122._16_4_ = bVar69 * uVar144 | !bVar69 * auVar122._16_4_;
        bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar122._20_4_ = bVar69 * uVar145 | !bVar69 * auVar122._20_4_;
        bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar122._24_4_ = bVar69 * uVar146 | !bVar69 * auVar122._24_4_;
        bVar69 = SUB81(uVar71 >> 7,0);
        auVar122._28_4_ = bVar69 * uVar147 | !bVar69 * auVar122._28_4_;
        auVar117 = vblendmps_avx512vl(auVar187,auVar117);
        bVar69 = (bool)((byte)(uVar61 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar61 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar61 >> 6) & 1);
        bVar16 = SUB81(uVar61 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar57 & 1) * auVar117._0_4_ | !(bool)(bVar57 & 1) * uVar56) |
             !(bool)(bVar64 & 1) * auVar123._0_4_;
        bVar10 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar10 * ((uint)bVar69 * auVar117._4_4_ | !bVar69 * uVar141) |
             !bVar10 * auVar123._4_4_;
        bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar69 * ((uint)bVar11 * auVar117._8_4_ | !bVar11 * uVar142) |
             !bVar69 * auVar123._8_4_;
        bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar69 * ((uint)bVar12 * auVar117._12_4_ | !bVar12 * uVar143) |
             !bVar69 * auVar123._12_4_;
        bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar69 * ((uint)bVar13 * auVar117._16_4_ | !bVar13 * uVar144) |
             !bVar69 * auVar123._16_4_;
        bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar69 * ((uint)bVar14 * auVar117._20_4_ | !bVar14 * uVar145) |
             !bVar69 * auVar123._20_4_;
        bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar69 * ((uint)bVar15 * auVar117._24_4_ | !bVar15 * uVar146) |
             !bVar69 * auVar123._24_4_;
        bVar69 = SUB81(uVar71 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar69 * ((uint)bVar16 * auVar117._28_4_ | !bVar16 * uVar147) |
             !bVar69 * auVar123._28_4_;
        bVar54 = (~bVar64 | bVar57) & bVar54;
      }
    }
    in_ZMM31 = ZEXT3264(auVar123);
    if ((bVar54 & 0x7f) == 0) {
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar255 = ZEXT3264(auVar82);
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = &DAT_3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar126._16_4_ = 0x3f800000;
      auVar126._20_4_ = 0x3f800000;
      auVar126._24_4_ = 0x3f800000;
      auVar126._28_4_ = 0x3f800000;
LAB_01ede76d:
      auVar215 = ZEXT3264(auVar126);
      auVar244 = ZEXT3264(local_8e0);
      auVar165 = ZEXT3264(local_800);
      auVar223 = ZEXT3264(local_940);
    }
    else {
      fVar230 = *(float *)(ray + k * 4 + 0x200) - (float)local_870._0_4_;
      auVar158._4_4_ = fVar230;
      auVar158._0_4_ = fVar230;
      auVar158._8_4_ = fVar230;
      auVar158._12_4_ = fVar230;
      auVar158._16_4_ = fVar230;
      auVar158._20_4_ = fVar230;
      auVar158._24_4_ = fVar230;
      auVar158._28_4_ = fVar230;
      auVar117 = vminps_avx512vl(auVar158,auVar123);
      auVar53._4_4_ = fStack_53c;
      auVar53._0_4_ = local_540;
      auVar53._8_4_ = fStack_538;
      auVar53._12_4_ = fStack_534;
      auVar53._16_4_ = fStack_530;
      auVar53._20_4_ = fStack_52c;
      auVar53._24_4_ = fStack_528;
      auVar53._28_4_ = fStack_524;
      auVar119 = vmaxps_avx512vl(auVar53,auVar122);
      auVar112 = vmulps_avx512vl(auVar112,auVar252);
      auVar111 = vfmadd213ps_avx512vl(auVar111,auVar249,auVar112);
      auVar110 = vfmadd213ps_avx512vl(auVar110,auVar125,auVar111);
      auVar111 = vmulps_avx512vl(local_700,auVar252);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar85,auVar249);
      auVar111 = vfmadd231ps_avx512vl(auVar111,local_720,auVar125);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar255 = ZEXT3264(auVar124);
      vandps_avx512vl(auVar111,auVar124);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar19 = vcmpps_avx512vl(auVar124,auVar112,1);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar125);
      auVar110 = vxorps_avx512vl(auVar110,auVar125);
      auVar120 = vrcp14ps_avx512vl(auVar111);
      auVar121 = vxorps_avx512vl(auVar111,auVar125);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar127 = vfnmadd213ps_avx512vl(auVar120,auVar111,auVar126);
      auVar127 = vfmadd132ps_avx512vl(auVar127,auVar120,auVar120);
      auVar127 = vmulps_avx512vl(auVar127,auVar110);
      uVar21 = vcmpps_avx512vl(auVar111,auVar121,1);
      bVar64 = (byte)uVar19 | (byte)uVar21;
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar110 = vblendmps_avx512vl(auVar127,auVar128);
      auVar129._0_4_ =
           (uint)(bVar64 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar120._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * auVar120._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * auVar120._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * auVar120._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * auVar120._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * auVar120._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar69 * auVar110._24_4_ | (uint)!bVar69 * auVar120._24_4_;
      auVar129._28_4_ =
           (uint)(bVar64 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar120._28_4_;
      auVar110 = vmaxps_avx(auVar119,auVar129);
      uVar21 = vcmpps_avx512vl(auVar111,auVar121,6);
      bVar64 = (byte)uVar19 | (byte)uVar21;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar130._0_4_ =
           (uint)(bVar64 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar127._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar69 * auVar119._4_4_ | (uint)!bVar69 * auVar127._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar69 * auVar119._8_4_ | (uint)!bVar69 * auVar127._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar69 * auVar119._12_4_ | (uint)!bVar69 * auVar127._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar69 * auVar119._16_4_ | (uint)!bVar69 * auVar127._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar69 * auVar119._20_4_ | (uint)!bVar69 * auVar127._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar69 * auVar119._24_4_ | (uint)!bVar69 * auVar127._24_4_;
      auVar130._28_4_ =
           (uint)(bVar64 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar127._28_4_;
      auVar111 = vminps_avx(auVar117,auVar130);
      auVar99 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
      auVar102 = vsubps_avx(ZEXT832(0) << 0x20,auVar102);
      auVar117 = ZEXT832(0) << 0x20;
      auVar103 = vsubps_avx(auVar117,auVar103);
      auVar40._4_4_ = auVar103._4_4_ * auVar107._4_4_;
      auVar40._0_4_ = auVar103._0_4_ * auVar107._0_4_;
      auVar40._8_4_ = auVar103._8_4_ * auVar107._8_4_;
      auVar40._12_4_ = auVar103._12_4_ * auVar107._12_4_;
      auVar40._16_4_ = auVar103._16_4_ * auVar107._16_4_;
      auVar40._20_4_ = auVar103._20_4_ * auVar107._20_4_;
      auVar40._24_4_ = auVar103._24_4_ * auVar107._24_4_;
      auVar40._28_4_ = auVar103._28_4_;
      auVar102 = vfnmsub231ps_avx512vl(auVar40,auVar106,auVar102);
      auVar99 = vfnmadd231ps_avx512vl(auVar102,auVar105,auVar99);
      auVar102 = vmulps_avx512vl(local_700,auVar107);
      auVar102 = vfnmsub231ps_avx512vl(auVar102,auVar85,auVar106);
      auVar102 = vfnmadd231ps_avx512vl(auVar102,local_720,auVar105);
      vandps_avx512vl(auVar102,auVar124);
      uVar19 = vcmpps_avx512vl(auVar102,auVar112,1);
      auVar99 = vxorps_avx512vl(auVar99,auVar125);
      auVar103 = vrcp14ps_avx512vl(auVar102);
      auVar105 = vxorps_avx512vl(auVar102,auVar125);
      auVar107 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar126);
      auVar74 = vfmadd132ps_fma(auVar107,auVar103,auVar103);
      fVar230 = auVar74._0_4_ * auVar99._0_4_;
      fVar237 = auVar74._4_4_ * auVar99._4_4_;
      auVar41._4_4_ = fVar237;
      auVar41._0_4_ = fVar230;
      fVar238 = auVar74._8_4_ * auVar99._8_4_;
      auVar41._8_4_ = fVar238;
      fVar239 = auVar74._12_4_ * auVar99._12_4_;
      auVar41._12_4_ = fVar239;
      fVar246 = auVar99._16_4_ * 0.0;
      auVar41._16_4_ = fVar246;
      fVar240 = auVar99._20_4_ * 0.0;
      auVar41._20_4_ = fVar240;
      fVar241 = auVar99._24_4_ * 0.0;
      auVar41._24_4_ = fVar241;
      auVar41._28_4_ = auVar99._28_4_;
      uVar21 = vcmpps_avx512vl(auVar102,auVar105,1);
      bVar64 = (byte)uVar19 | (byte)uVar21;
      auVar107 = vblendmps_avx512vl(auVar41,auVar128);
      auVar131._0_4_ =
           (uint)(bVar64 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar103._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar69 * auVar107._4_4_ | (uint)!bVar69 * auVar103._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar69 * auVar107._8_4_ | (uint)!bVar69 * auVar103._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar69 * auVar107._12_4_ | (uint)!bVar69 * auVar103._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar69 * auVar107._16_4_ | (uint)!bVar69 * auVar103._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar69 * auVar107._20_4_ | (uint)!bVar69 * auVar103._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar69 * auVar107._24_4_ | (uint)!bVar69 * auVar103._24_4_;
      auVar131._28_4_ =
           (uint)(bVar64 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar103._28_4_;
      _local_760 = vmaxps_avx(auVar110,auVar131);
      uVar21 = vcmpps_avx512vl(auVar102,auVar105,6);
      bVar64 = (byte)uVar19 | (byte)uVar21;
      auVar132._0_4_ =
           (uint)(bVar64 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar230;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar69 * auVar119._4_4_ | (uint)!bVar69 * (int)fVar237;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar69 * auVar119._8_4_ | (uint)!bVar69 * (int)fVar238;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar69 * auVar119._12_4_ | (uint)!bVar69 * (int)fVar239;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar69 * auVar119._16_4_ | (uint)!bVar69 * (int)fVar246;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar69 * auVar119._20_4_ | (uint)!bVar69 * (int)fVar240;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar69 * auVar119._24_4_ | (uint)!bVar69 * (int)fVar241;
      auVar132._28_4_ =
           (uint)(bVar64 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar99._28_4_;
      local_5a0 = vminps_avx(auVar111,auVar132);
      uVar19 = vcmpps_avx512vl(_local_760,local_5a0,2);
      bVar54 = bVar54 & 0x7f & (byte)uVar19;
      if (bVar54 == 0) goto LAB_01ede76d;
      auVar82 = vmaxps_avx(auVar117,auVar82);
      auVar99 = vminps_avx512vl(local_620,auVar126);
      auVar48 = ZEXT412(0);
      auVar102 = ZEXT1232(auVar48) << 0x20;
      auVar99 = vmaxps_avx(auVar99,ZEXT1232(auVar48) << 0x20);
      auVar103 = vminps_avx512vl(local_640,auVar126);
      auVar42._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar99._28_4_ + 7.0;
      local_620 = vfmadd213ps_avx512vl(auVar42,local_920,auVar228);
      auVar99 = vmaxps_avx(auVar103,ZEXT1232(auVar48) << 0x20);
      auVar43._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar43._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar43._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar43._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar43._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar43._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar43._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar43._28_4_ = auVar99._28_4_ + 7.0;
      local_640 = vfmadd213ps_avx512vl(auVar43,local_920,auVar228);
      auVar44._4_4_ = auVar82._4_4_ * auVar82._4_4_;
      auVar44._0_4_ = auVar82._0_4_ * auVar82._0_4_;
      auVar44._8_4_ = auVar82._8_4_ * auVar82._8_4_;
      auVar44._12_4_ = auVar82._12_4_ * auVar82._12_4_;
      auVar44._16_4_ = auVar82._16_4_ * auVar82._16_4_;
      auVar44._20_4_ = auVar82._20_4_ * auVar82._20_4_;
      auVar44._24_4_ = auVar82._24_4_ * auVar82._24_4_;
      auVar44._28_4_ = local_640._28_4_;
      auVar82 = vsubps_avx(auVar116,auVar44);
      auVar99 = vmulps_avx512vl(auVar114,auVar82);
      auVar99 = vsubps_avx512vl(auVar118,auVar99);
      uVar19 = vcmpps_avx512vl(auVar99,ZEXT1232(auVar48) << 0x20,5);
      bVar64 = (byte)uVar19;
      if (bVar64 == 0) {
        auVar96 = ZEXT832(0) << 0x20;
        auVar165 = ZEXT864(0) << 0x20;
        auVar99 = ZEXT832(0) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar245 = ZEXT828(0) << 0x20;
        auVar133._8_4_ = 0x7f800000;
        auVar133._0_8_ = 0x7f8000007f800000;
        auVar133._12_4_ = 0x7f800000;
        auVar133._16_4_ = 0x7f800000;
        auVar133._20_4_ = 0x7f800000;
        auVar133._24_4_ = 0x7f800000;
        auVar133._28_4_ = 0x7f800000;
        auVar134._8_4_ = 0xff800000;
        auVar134._0_8_ = 0xff800000ff800000;
        auVar134._12_4_ = 0xff800000;
        auVar134._16_4_ = 0xff800000;
        auVar134._20_4_ = 0xff800000;
        auVar134._24_4_ = 0xff800000;
        auVar134._28_4_ = 0xff800000;
      }
      else {
        auVar75 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
        uVar71 = vcmpps_avx512vl(auVar99,auVar117,5);
        auVar99 = vsqrtps_avx(auVar99);
        auVar182._0_4_ = auVar108._0_4_ + auVar108._0_4_;
        auVar182._4_4_ = auVar108._4_4_ + auVar108._4_4_;
        auVar182._8_4_ = auVar108._8_4_ + auVar108._8_4_;
        auVar182._12_4_ = auVar108._12_4_ + auVar108._12_4_;
        auVar182._16_4_ = auVar108._16_4_ + auVar108._16_4_;
        auVar182._20_4_ = auVar108._20_4_ + auVar108._20_4_;
        auVar182._24_4_ = auVar108._24_4_ + auVar108._24_4_;
        auVar182._28_4_ = auVar108._28_4_ + auVar108._28_4_;
        auVar102 = vrcp14ps_avx512vl(auVar182);
        auVar103 = vfnmadd213ps_avx512vl(auVar182,auVar102,auVar126);
        auVar74 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
        auVar31._8_4_ = 0x80000000;
        auVar31._0_8_ = 0x8000000080000000;
        auVar31._12_4_ = 0x80000000;
        auVar31._16_4_ = 0x80000000;
        auVar31._20_4_ = 0x80000000;
        auVar31._24_4_ = 0x80000000;
        auVar31._28_4_ = 0x80000000;
        auVar102 = vxorps_avx512vl(auVar113,auVar31);
        auVar102 = vsubps_avx(auVar102,auVar99);
        auVar45._4_4_ = auVar102._4_4_ * auVar74._4_4_;
        auVar45._0_4_ = auVar102._0_4_ * auVar74._0_4_;
        auVar45._8_4_ = auVar102._8_4_ * auVar74._8_4_;
        auVar45._12_4_ = auVar102._12_4_ * auVar74._12_4_;
        auVar45._16_4_ = auVar102._16_4_ * 0.0;
        auVar45._20_4_ = auVar102._20_4_ * 0.0;
        auVar45._24_4_ = auVar102._24_4_ * 0.0;
        auVar45._28_4_ = 0x3e000000;
        auVar99 = vsubps_avx512vl(auVar99,auVar113);
        auVar253._0_4_ = auVar99._0_4_ * auVar74._0_4_;
        auVar253._4_4_ = auVar99._4_4_ * auVar74._4_4_;
        auVar253._8_4_ = auVar99._8_4_ * auVar74._8_4_;
        auVar253._12_4_ = auVar99._12_4_ * auVar74._12_4_;
        auVar253._16_4_ = auVar99._16_4_ * 0.0;
        auVar253._20_4_ = auVar99._20_4_ * 0.0;
        auVar253._24_4_ = auVar99._24_4_ * 0.0;
        auVar253._28_4_ = 0;
        auVar99 = vfmadd213ps_avx512vl(auVar115,auVar45,auVar96);
        auVar46._4_4_ = auVar104._4_4_ * auVar99._4_4_;
        auVar46._0_4_ = auVar104._0_4_ * auVar99._0_4_;
        auVar46._8_4_ = auVar104._8_4_ * auVar99._8_4_;
        auVar46._12_4_ = auVar104._12_4_ * auVar99._12_4_;
        auVar46._16_4_ = auVar104._16_4_ * auVar99._16_4_;
        auVar46._20_4_ = auVar104._20_4_ * auVar99._20_4_;
        auVar46._24_4_ = auVar104._24_4_ * auVar99._24_4_;
        auVar46._28_4_ = auVar102._28_4_;
        auVar99 = vmulps_avx512vl(local_720,auVar45);
        auVar102 = vmulps_avx512vl(auVar85,auVar45);
        auVar105 = vmulps_avx512vl(local_700,auVar45);
        auVar103 = vfmadd213ps_avx512vl(auVar97,auVar46,auVar100);
        auVar99 = vsubps_avx512vl(auVar99,auVar103);
        auVar103 = vfmadd213ps_avx512vl(auVar98,auVar46,auVar101);
        auVar103 = vsubps_avx512vl(auVar102,auVar103);
        auVar74 = vfmadd213ps_fma(auVar46,auVar109,local_8c0);
        auVar102 = vsubps_avx(auVar105,ZEXT1632(auVar74));
        auVar245 = auVar102._0_28_;
        auVar96 = vfmadd213ps_avx512vl(auVar115,auVar253,auVar96);
        auVar104 = vmulps_avx512vl(auVar104,auVar96);
        auVar96 = vmulps_avx512vl(local_720,auVar253);
        auVar105 = vmulps_avx512vl(auVar85,auVar253);
        auVar106 = vmulps_avx512vl(local_700,auVar253);
        auVar74 = vfmadd213ps_fma(auVar97,auVar104,auVar100);
        auVar102 = vsubps_avx(auVar96,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar98,auVar104,auVar101);
        auVar96 = vsubps_avx512vl(auVar105,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar109,auVar104,local_8c0);
        auVar97 = vsubps_avx512vl(auVar106,ZEXT1632(auVar74));
        auVar165 = ZEXT3264(auVar97);
        auVar204._8_4_ = 0x7f800000;
        auVar204._0_8_ = 0x7f8000007f800000;
        auVar204._12_4_ = 0x7f800000;
        auVar204._16_4_ = 0x7f800000;
        auVar204._20_4_ = 0x7f800000;
        auVar204._24_4_ = 0x7f800000;
        auVar204._28_4_ = 0x7f800000;
        auVar97 = vblendmps_avx512vl(auVar204,auVar45);
        bVar69 = (bool)((byte)uVar71 & 1);
        auVar133._0_4_ = (uint)bVar69 * auVar97._0_4_ | (uint)!bVar69 * auVar100._0_4_;
        bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar69 * auVar97._4_4_ | (uint)!bVar69 * auVar100._4_4_;
        bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar69 * auVar97._8_4_ | (uint)!bVar69 * auVar100._8_4_;
        bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar69 * auVar97._12_4_ | (uint)!bVar69 * auVar100._12_4_;
        bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar69 * auVar97._16_4_ | (uint)!bVar69 * auVar100._16_4_;
        bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar69 * auVar97._20_4_ | (uint)!bVar69 * auVar100._20_4_;
        bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar69 * auVar97._24_4_ | (uint)!bVar69 * auVar100._24_4_;
        bVar69 = SUB81(uVar71 >> 7,0);
        auVar133._28_4_ = (uint)bVar69 * auVar97._28_4_ | (uint)!bVar69 * auVar100._28_4_;
        auVar205._8_4_ = 0xff800000;
        auVar205._0_8_ = 0xff800000ff800000;
        auVar205._12_4_ = 0xff800000;
        auVar205._16_4_ = 0xff800000;
        auVar205._20_4_ = 0xff800000;
        auVar205._24_4_ = 0xff800000;
        auVar205._28_4_ = 0xff800000;
        auVar97 = vblendmps_avx512vl(auVar205,auVar253);
        bVar69 = (bool)((byte)uVar71 & 1);
        auVar134._0_4_ = (uint)bVar69 * auVar97._0_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar69 * auVar97._4_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar69 * auVar97._8_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar69 * auVar97._12_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar134._16_4_ = (uint)bVar69 * auVar97._16_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar134._20_4_ = (uint)bVar69 * auVar97._20_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar134._24_4_ = (uint)bVar69 * auVar97._24_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = SUB81(uVar71 >> 7,0);
        auVar134._28_4_ = (uint)bVar69 * auVar97._28_4_ | (uint)!bVar69 * -0x800000;
        vandps_avx512vl(auVar124,local_740);
        auVar97 = vmaxps_avx(local_5e0,auVar134);
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar97 = vmulps_avx512vl(auVar97,auVar32);
        vandps_avx512vl(auVar108,auVar124);
        uVar61 = vcmpps_avx512vl(auVar97,auVar97,1);
        uVar71 = uVar71 & uVar61;
        bVar57 = (byte)uVar71;
        if (bVar57 != 0) {
          uVar61 = vcmpps_avx512vl(auVar82,ZEXT1632(auVar75),2);
          auVar243._8_4_ = 0xff800000;
          auVar243._0_8_ = 0xff800000ff800000;
          auVar243._12_4_ = 0xff800000;
          auVar243._16_4_ = 0xff800000;
          auVar243._20_4_ = 0xff800000;
          auVar243._24_4_ = 0xff800000;
          auVar243._28_4_ = 0xff800000;
          auVar247._8_4_ = 0x7f800000;
          auVar247._0_8_ = 0x7f8000007f800000;
          auVar247._12_4_ = 0x7f800000;
          auVar247._16_4_ = 0x7f800000;
          auVar247._20_4_ = 0x7f800000;
          auVar247._24_4_ = 0x7f800000;
          auVar247._28_4_ = 0x7f800000;
          auVar82 = vblendmps_avx512vl(auVar247,auVar243);
          bVar63 = (byte)uVar61;
          uVar56 = (uint)(bVar63 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar97._0_4_;
          bVar69 = (bool)((byte)(uVar61 >> 1) & 1);
          uVar141 = (uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * auVar97._4_4_;
          bVar69 = (bool)((byte)(uVar61 >> 2) & 1);
          uVar142 = (uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * auVar97._8_4_;
          bVar69 = (bool)((byte)(uVar61 >> 3) & 1);
          uVar143 = (uint)bVar69 * auVar82._12_4_ | (uint)!bVar69 * auVar97._12_4_;
          bVar69 = (bool)((byte)(uVar61 >> 4) & 1);
          uVar144 = (uint)bVar69 * auVar82._16_4_ | (uint)!bVar69 * auVar97._16_4_;
          bVar69 = (bool)((byte)(uVar61 >> 5) & 1);
          uVar145 = (uint)bVar69 * auVar82._20_4_ | (uint)!bVar69 * auVar97._20_4_;
          bVar69 = (bool)((byte)(uVar61 >> 6) & 1);
          uVar146 = (uint)bVar69 * auVar82._24_4_ | (uint)!bVar69 * auVar97._24_4_;
          bVar69 = SUB81(uVar61 >> 7,0);
          uVar147 = (uint)bVar69 * auVar82._28_4_ | (uint)!bVar69 * auVar97._28_4_;
          auVar133._0_4_ = (bVar57 & 1) * uVar56 | !(bool)(bVar57 & 1) * auVar133._0_4_;
          bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar133._4_4_ = bVar69 * uVar141 | !bVar69 * auVar133._4_4_;
          bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar133._8_4_ = bVar69 * uVar142 | !bVar69 * auVar133._8_4_;
          bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar133._12_4_ = bVar69 * uVar143 | !bVar69 * auVar133._12_4_;
          bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar133._16_4_ = bVar69 * uVar144 | !bVar69 * auVar133._16_4_;
          bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar133._20_4_ = bVar69 * uVar145 | !bVar69 * auVar133._20_4_;
          bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar133._24_4_ = bVar69 * uVar146 | !bVar69 * auVar133._24_4_;
          bVar69 = SUB81(uVar71 >> 7,0);
          auVar133._28_4_ = bVar69 * uVar147 | !bVar69 * auVar133._28_4_;
          auVar82 = vblendmps_avx512vl(auVar243,auVar247);
          bVar69 = (bool)((byte)(uVar61 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar61 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar61 >> 6) & 1);
          bVar16 = SUB81(uVar61 >> 7,0);
          auVar134._0_4_ =
               (uint)(bVar57 & 1) *
               ((uint)(bVar63 & 1) * auVar82._0_4_ | !(bool)(bVar63 & 1) * uVar56) |
               !(bool)(bVar57 & 1) * auVar134._0_4_;
          bVar10 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar134._4_4_ =
               (uint)bVar10 * ((uint)bVar69 * auVar82._4_4_ | !bVar69 * uVar141) |
               !bVar10 * auVar134._4_4_;
          bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar134._8_4_ =
               (uint)bVar69 * ((uint)bVar11 * auVar82._8_4_ | !bVar11 * uVar142) |
               !bVar69 * auVar134._8_4_;
          bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar134._12_4_ =
               (uint)bVar69 * ((uint)bVar12 * auVar82._12_4_ | !bVar12 * uVar143) |
               !bVar69 * auVar134._12_4_;
          bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar134._16_4_ =
               (uint)bVar69 * ((uint)bVar13 * auVar82._16_4_ | !bVar13 * uVar144) |
               !bVar69 * auVar134._16_4_;
          bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar134._20_4_ =
               (uint)bVar69 * ((uint)bVar14 * auVar82._20_4_ | !bVar14 * uVar145) |
               !bVar69 * auVar134._20_4_;
          bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar134._24_4_ =
               (uint)bVar69 * ((uint)bVar15 * auVar82._24_4_ | !bVar15 * uVar146) |
               !bVar69 * auVar134._24_4_;
          bVar69 = SUB81(uVar71 >> 7,0);
          auVar134._28_4_ =
               (uint)bVar69 * ((uint)bVar16 * auVar82._28_4_ | !bVar16 * uVar147) |
               !bVar69 * auVar134._28_4_;
          bVar64 = (~bVar57 | bVar63) & bVar64;
        }
      }
      auVar215._0_4_ = local_700._0_4_ * auVar165._0_4_;
      auVar215._4_4_ = local_700._4_4_ * auVar165._4_4_;
      auVar215._8_4_ = local_700._8_4_ * auVar165._8_4_;
      auVar215._12_4_ = local_700._12_4_ * auVar165._12_4_;
      auVar215._16_4_ = local_700._16_4_ * auVar165._16_4_;
      auVar215._20_4_ = local_700._20_4_ * auVar165._20_4_;
      auVar215._28_36_ = auVar165._28_36_;
      auVar215._24_4_ = local_700._24_4_ * auVar165._24_4_;
      auVar82 = vfmadd231ps_avx512vl(auVar215._0_32_,auVar85,auVar96);
      auVar74 = vfmadd231ps_fma(auVar82,local_720,auVar102);
      _local_500 = _local_760;
      local_4e0 = vminps_avx(local_5a0,auVar133);
      vandps_avx512vl(ZEXT1632(auVar74),auVar124);
      _local_680 = vmaxps_avx(_local_760,auVar134);
      _local_5c0 = _local_680;
      auVar206._8_4_ = 0x3e99999a;
      auVar206._0_8_ = 0x3e99999a3e99999a;
      auVar206._12_4_ = 0x3e99999a;
      auVar206._16_4_ = 0x3e99999a;
      auVar206._20_4_ = 0x3e99999a;
      auVar206._24_4_ = 0x3e99999a;
      auVar206._28_4_ = 0x3e99999a;
      uVar19 = vcmpps_avx512vl(auVar82,auVar206,1);
      uVar21 = vcmpps_avx512vl(_local_760,local_4e0,2);
      bVar57 = (byte)uVar21 & bVar54;
      uVar20 = vcmpps_avx512vl(_local_680,local_5a0,2);
      if ((bVar54 & ((byte)uVar20 | (byte)uVar21)) == 0) {
        auVar215 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar244 = ZEXT3264(local_8e0);
        auVar165 = ZEXT3264(local_800);
        auVar223 = ZEXT3264(local_940);
      }
      else {
        auVar47._4_4_ = auVar245._4_4_ * local_700._4_4_;
        auVar47._0_4_ = auVar245._0_4_ * local_700._0_4_;
        auVar47._8_4_ = auVar245._8_4_ * local_700._8_4_;
        auVar47._12_4_ = auVar245._12_4_ * local_700._12_4_;
        auVar47._16_4_ = auVar245._16_4_ * local_700._16_4_;
        auVar47._20_4_ = auVar245._20_4_ * local_700._20_4_;
        auVar47._24_4_ = auVar245._24_4_ * local_700._24_4_;
        auVar47._28_4_ = 0x3e99999a;
        auVar82 = vfmadd213ps_avx512vl(auVar103,auVar85,auVar47);
        auVar74 = vfmadd213ps_fma(auVar99,local_720,auVar82);
        vandps_avx512vl(ZEXT1632(auVar74),auVar124);
        uVar21 = vcmpps_avx512vl(auVar82,auVar206,1);
        bVar63 = (byte)uVar21 | ~bVar64;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar82 = vpblendmd_avx512vl(auVar159,auVar33);
        local_580._0_4_ = (uint)(bVar63 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
        bVar69 = (bool)(bVar63 >> 1 & 1);
        local_580._4_4_ = (uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 2 & 1);
        local_580._8_4_ = (uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 3 & 1);
        local_580._12_4_ = (uint)bVar69 * auVar82._12_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 4 & 1);
        local_580._16_4_ = (uint)bVar69 * auVar82._16_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 5 & 1);
        local_580._20_4_ = (uint)bVar69 * auVar82._20_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 6 & 1);
        local_580._24_4_ = (uint)bVar69 * auVar82._24_4_ | (uint)!bVar69 * 2;
        local_580._28_4_ = (uint)(bVar63 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
        local_600 = vpbroadcastd_avx512vl();
        uVar21 = vpcmpd_avx512vl(local_600,local_580,5);
        bVar63 = (byte)uVar21 & bVar57;
        if (bVar63 == 0) {
          auVar219._8_4_ = 0x7fffffff;
          auVar219._0_8_ = 0x7fffffff7fffffff;
          auVar219._12_4_ = 0x7fffffff;
        }
        else {
          auVar75 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar74 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar76 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar77 = vminps_avx(auVar75,auVar76);
          auVar75 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar76 = vmaxps_avx(auVar74,auVar75);
          auVar189._8_4_ = 0x7fffffff;
          auVar189._0_8_ = 0x7fffffff7fffffff;
          auVar189._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar77,auVar189);
          auVar75 = vandps_avx(auVar76,auVar189);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar230 = auVar74._0_4_ * 1.9073486e-06;
          local_880 = vshufps_avx(auVar76,auVar76,0xff);
          local_660 = (float)local_760._0_4_ + (float)local_6e0._0_4_;
          fStack_65c = (float)local_760._4_4_ + (float)local_6e0._4_4_;
          fStack_658 = fStack_758 + fStack_6d8;
          fStack_654 = fStack_754 + fStack_6d4;
          fStack_650 = fStack_750 + fStack_6d0;
          fStack_64c = fStack_74c + fStack_6cc;
          fStack_648 = fStack_748 + fStack_6c8;
          fStack_644 = fStack_744 + fStack_6c4;
          do {
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar82 = vblendmps_avx512vl(auVar160,_local_760);
            auVar135._0_4_ =
                 (uint)(bVar63 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar69 * auVar82._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar69 * auVar82._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar69 * auVar82._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar135._24_4_ =
                 (uint)(bVar63 >> 6) * auVar82._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar82 = vshufps_avx(auVar135,auVar135,0xb1);
            auVar82 = vminps_avx(auVar135,auVar82);
            auVar96 = vshufpd_avx(auVar82,auVar82,5);
            auVar82 = vminps_avx(auVar82,auVar96);
            auVar96 = vpermpd_avx2(auVar82,0x4e);
            auVar82 = vminps_avx(auVar82,auVar96);
            uVar21 = vcmpps_avx512vl(auVar135,auVar82,0);
            bVar55 = (byte)uVar21 & bVar63;
            bVar66 = bVar63;
            if (bVar55 != 0) {
              bVar66 = bVar55;
            }
            iVar22 = 0;
            for (uVar56 = (uint)bVar66; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            bVar66 = '\x01' << ((byte)iVar22 & 0x1f);
            uVar56 = *(uint *)(local_620 + (uint)(iVar22 << 2));
            fVar237 = *(float *)(local_500 + (uint)(iVar22 << 2));
            fVar238 = auVar17._0_4_;
            if ((float)local_900._0_4_ < 0.0) {
              fVar238 = sqrtf((float)local_900._0_4_);
            }
            auVar255 = ZEXT464(uVar56);
            bVar55 = ~bVar66;
            lVar67 = 5;
            do {
              auVar149._4_4_ = fVar237;
              auVar149._0_4_ = fVar237;
              auVar149._8_4_ = fVar237;
              auVar149._12_4_ = fVar237;
              auVar75 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_8f0);
              fVar246 = auVar255._0_4_;
              fVar239 = 1.0 - fVar246;
              auVar190._0_4_ = local_7c0._0_4_ * fVar246;
              auVar190._4_4_ = local_7c0._4_4_ * fVar246;
              auVar190._8_4_ = local_7c0._8_4_ * fVar246;
              auVar190._12_4_ = local_7c0._12_4_ * fVar246;
              local_820 = ZEXT416((uint)fVar239);
              auVar210._4_4_ = fVar239;
              auVar210._0_4_ = fVar239;
              auVar210._8_4_ = fVar239;
              auVar210._12_4_ = fVar239;
              auVar74 = vfmadd231ps_fma(auVar190,auVar210,local_780._0_16_);
              auVar217._0_4_ = local_7a0._0_4_ * fVar246;
              auVar217._4_4_ = local_7a0._4_4_ * fVar246;
              auVar217._8_4_ = local_7a0._8_4_ * fVar246;
              auVar217._12_4_ = local_7a0._12_4_ * fVar246;
              auVar76 = vfmadd231ps_fma(auVar217,auVar210,local_7c0._0_16_);
              auVar226._0_4_ = fVar246 * (float)local_7e0._0_4_;
              auVar226._4_4_ = fVar246 * (float)local_7e0._4_4_;
              auVar226._8_4_ = fVar246 * fStack_7d8;
              auVar226._12_4_ = fVar246 * fStack_7d4;
              auVar77 = vfmadd231ps_fma(auVar226,auVar210,local_7a0._0_16_);
              auVar233._0_4_ = fVar246 * auVar76._0_4_;
              auVar233._4_4_ = fVar246 * auVar76._4_4_;
              auVar233._8_4_ = fVar246 * auVar76._8_4_;
              auVar233._12_4_ = fVar246 * auVar76._12_4_;
              auVar74 = vfmadd231ps_fma(auVar233,auVar210,auVar74);
              auVar191._0_4_ = fVar246 * auVar77._0_4_;
              auVar191._4_4_ = fVar246 * auVar77._4_4_;
              auVar191._8_4_ = fVar246 * auVar77._8_4_;
              auVar191._12_4_ = fVar246 * auVar77._12_4_;
              auVar76 = vfmadd231ps_fma(auVar191,auVar210,auVar76);
              auVar218._0_4_ = fVar246 * auVar76._0_4_;
              auVar218._4_4_ = fVar246 * auVar76._4_4_;
              auVar218._8_4_ = fVar246 * auVar76._8_4_;
              auVar218._12_4_ = fVar246 * auVar76._12_4_;
              auVar77 = vfmadd231ps_fma(auVar218,auVar74,auVar210);
              auVar74 = vsubps_avx(auVar76,auVar74);
              auVar23._8_4_ = 0x40400000;
              auVar23._0_8_ = 0x4040000040400000;
              auVar23._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar74,auVar23);
              local_740._0_16_ = auVar77;
              auVar74 = vsubps_avx(auVar75,auVar77);
              local_920._0_16_ = auVar74;
              auVar74 = vdpps_avx(auVar74,auVar74,0x7f);
              local_8c0._0_16_ = auVar74;
              if (auVar74._0_4_ < 0.0) {
                auVar165._0_4_ = sqrtf(auVar74._0_4_);
                auVar165._4_60_ = extraout_var;
                auVar74 = auVar165._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar74,auVar74);
              }
              local_830 = vdpps_avx(auVar76,auVar76,0x7f);
              fVar239 = local_830._0_4_;
              auVar192._4_12_ = ZEXT812(0) << 0x20;
              auVar192._0_4_ = fVar239;
              auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
              fVar240 = auVar75._0_4_;
              local_840 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_830,auVar24);
              auVar75 = vfnmadd213ss_fma(local_840,local_830,ZEXT416(0x40000000));
              uVar56 = auVar74._0_4_;
              if (fVar239 < auVar77._0_4_) {
                auVar223._0_4_ = sqrtf(fVar239);
                auVar223._4_60_ = extraout_var_00;
                auVar74 = ZEXT416(uVar56);
                auVar77 = auVar223._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx512f(local_830,local_830);
              }
              fVar239 = fVar240 * 1.5 + fVar239 * -0.5 * fVar240 * fVar240 * fVar240;
              local_850._0_4_ = auVar76._0_4_ * fVar239;
              local_850._4_4_ = auVar76._4_4_ * fVar239;
              local_850._8_4_ = auVar76._8_4_ * fVar239;
              local_850._12_4_ = auVar76._12_4_ * fVar239;
              auVar2 = vdpps_avx(local_920._0_16_,local_850,0x7f);
              auVar78 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
              auVar150._0_4_ = auVar2._0_4_ * auVar2._0_4_;
              auVar150._4_4_ = auVar2._4_4_ * auVar2._4_4_;
              auVar150._8_4_ = auVar2._8_4_ * auVar2._8_4_;
              auVar150._12_4_ = auVar2._12_4_ * auVar2._12_4_;
              auVar73 = vsubps_avx(local_8c0._0_16_,auVar150);
              fVar240 = auVar73._0_4_;
              auVar169._4_12_ = ZEXT812(0) << 0x20;
              auVar169._0_4_ = fVar240;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
              fVar241 = auVar79._0_4_;
              uVar70 = fVar240 == 0.0;
              uVar68 = fVar240 < 0.0;
              if ((bool)uVar68) {
                local_860 = fVar239;
                fStack_85c = fVar239;
                fStack_858 = fVar239;
                fStack_854 = fVar239;
                fVar242 = sqrtf(fVar240);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar74 = ZEXT416(uVar56);
                auVar78 = ZEXT416(auVar78._0_4_);
                fVar239 = local_860;
                fVar208 = fStack_85c;
                fVar250 = fStack_858;
                fVar251 = fStack_854;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                fVar242 = auVar73._0_4_;
                fVar208 = fVar239;
                fVar250 = fVar239;
                fVar251 = fVar239;
              }
              auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar255._0_16_,local_820);
              fVar167 = auVar73._0_4_ * 6.0;
              fVar18 = fVar246 * 6.0;
              auVar193._0_4_ = fVar18 * (float)local_7e0._0_4_;
              auVar193._4_4_ = fVar18 * (float)local_7e0._4_4_;
              auVar193._8_4_ = fVar18 * fStack_7d8;
              auVar193._12_4_ = fVar18 * fStack_7d4;
              auVar170._4_4_ = fVar167;
              auVar170._0_4_ = fVar167;
              auVar170._8_4_ = fVar167;
              auVar170._12_4_ = fVar167;
              auVar73 = vfmadd132ps_fma(auVar170,auVar193,local_7a0._0_16_);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820,auVar255._0_16_);
              fVar167 = auVar79._0_4_ * 6.0;
              auVar194._4_4_ = fVar167;
              auVar194._0_4_ = fVar167;
              auVar194._8_4_ = fVar167;
              auVar194._12_4_ = fVar167;
              auVar73 = vfmadd132ps_fma(auVar194,auVar73,local_7c0._0_16_);
              fVar167 = local_820._0_4_ * 6.0;
              auVar171._4_4_ = fVar167;
              auVar171._0_4_ = fVar167;
              auVar171._8_4_ = fVar167;
              auVar171._12_4_ = fVar167;
              auVar73 = vfmadd132ps_fma(auVar171,auVar73,local_780._0_16_);
              auVar195._0_4_ = auVar73._0_4_ * (float)local_830._0_4_;
              auVar195._4_4_ = auVar73._4_4_ * (float)local_830._0_4_;
              auVar195._8_4_ = auVar73._8_4_ * (float)local_830._0_4_;
              auVar195._12_4_ = auVar73._12_4_ * (float)local_830._0_4_;
              auVar73 = vdpps_avx(auVar76,auVar73,0x7f);
              fVar167 = auVar73._0_4_;
              auVar172._0_4_ = auVar76._0_4_ * fVar167;
              auVar172._4_4_ = auVar76._4_4_ * fVar167;
              auVar172._8_4_ = auVar76._8_4_ * fVar167;
              auVar172._12_4_ = auVar76._12_4_ * fVar167;
              auVar79 = vsubps_avx(auVar195,auVar172);
              fVar167 = auVar75._0_4_ * (float)local_840._0_4_;
              auVar73 = vmaxss_avx(ZEXT416((uint)fVar230),
                                   ZEXT416((uint)(fVar237 * fVar238 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar76,auVar25);
              auVar196._0_4_ = fVar239 * auVar79._0_4_ * fVar167;
              auVar196._4_4_ = fVar208 * auVar79._4_4_ * fVar167;
              auVar196._8_4_ = fVar250 * auVar79._8_4_ * fVar167;
              auVar196._12_4_ = fVar251 * auVar79._12_4_ * fVar167;
              auVar75 = vdpps_avx(auVar80,local_850,0x7f);
              auVar79 = vdivss_avx512f(ZEXT416((uint)fVar230),auVar77);
              auVar77 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar230),auVar73);
              auVar74 = vdpps_avx(local_920._0_16_,auVar196,0x7f);
              vfmadd213ss_avx512f(auVar78,auVar79,auVar77);
              fVar239 = auVar75._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_8f0,local_850,0x7f);
              auVar75 = vdpps_avx(local_920._0_16_,auVar80,0x7f);
              fVar240 = fVar241 * fVar240 * -0.5 * fVar241 * fVar241 + fVar241 * 1.5;
              auVar77 = vdpps_avx(local_920._0_16_,local_8f0,0x7f);
              in_ZMM31 = ZEXT1664(auVar2);
              auVar78 = vfnmadd231ss_avx512f(auVar75,auVar2,ZEXT416((uint)fVar239));
              auVar79 = vfnmadd231ss_avx512f(auVar77,auVar2,auVar74);
              auVar75 = vpermilps_avx(local_740._0_16_,0xff);
              fVar242 = fVar242 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar76,auVar76,0xff);
              auVar77 = vfmsub213ss_fma(auVar78,ZEXT416((uint)fVar240),auVar75);
              fVar240 = auVar79._0_4_ * fVar240;
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar77._0_4_)),
                                        ZEXT416((uint)fVar239),ZEXT416((uint)fVar240));
              fVar241 = auVar78._0_4_;
              auVar234._0_4_ = fVar240 / fVar241;
              auVar234._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar211._0_4_ = auVar77._0_4_ / fVar241;
              auVar211._4_12_ = auVar77._4_12_;
              auVar77 = vmulss_avx512f(auVar2,auVar234);
              auVar78 = vmulss_avx512f(auVar2,auVar211);
              fVar246 = fVar246 - (auVar77._0_4_ - fVar242 * (auVar74._0_4_ / fVar241));
              auVar255 = ZEXT464((uint)fVar246);
              fVar237 = fVar237 - (fVar242 * (fVar239 / fVar241) - auVar78._0_4_);
              auVar219._8_4_ = 0x7fffffff;
              auVar219._0_8_ = 0x7fffffff7fffffff;
              auVar219._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(auVar2,auVar219);
              auVar74 = vucomiss_avx512f(auVar74);
              bVar69 = true;
              if (!(bool)uVar68 && !(bool)uVar70) {
                auVar74 = vaddss_avx512f(auVar73,auVar74);
                auVar77 = vfmadd231ss_fma(auVar74,local_880,ZEXT416(0x36000000));
                auVar74 = vandps_avx(ZEXT416((uint)fVar242),auVar219);
                if (auVar74._0_4_ < auVar77._0_4_) {
                  fVar237 = fVar237 + (float)local_870._0_4_;
                  if ((((fVar148 <= fVar237) &&
                       (fVar239 = *(float *)(ray + k * 4 + 0x200), fVar237 <= fVar239)) &&
                      (0.0 <= fVar246)) && (fVar246 <= 1.0)) {
                    auVar49._12_4_ = 0;
                    auVar49._0_12_ = ZEXT812(0);
                    auVar74 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)local_8c0._0_4_));
                    fVar240 = auVar74._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar58].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar66 = true;
                      }
                      else {
                        fVar240 = fVar240 * 1.5 +
                                  (float)local_8c0._0_4_ * -0.5 * fVar240 * fVar240 * fVar240;
                        auVar173._0_4_ = local_920._0_4_ * fVar240;
                        auVar173._4_4_ = local_920._4_4_ * fVar240;
                        auVar173._8_4_ = local_920._8_4_ * fVar240;
                        auVar173._12_4_ = local_920._12_4_ * fVar240;
                        auVar77 = vfmadd213ps_fma(auVar75,auVar173,auVar76);
                        auVar74 = vshufps_avx(auVar173,auVar173,0xc9);
                        auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                        auVar174._0_4_ = auVar173._0_4_ * auVar75._0_4_;
                        auVar174._4_4_ = auVar173._4_4_ * auVar75._4_4_;
                        auVar174._8_4_ = auVar173._8_4_ * auVar75._8_4_;
                        auVar174._12_4_ = auVar173._12_4_ * auVar75._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar174,auVar76,auVar74);
                        auVar74 = vshufps_avx(auVar76,auVar76,0xc9);
                        auVar75 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                        auVar151._0_4_ = auVar77._0_4_ * auVar76._0_4_;
                        auVar151._4_4_ = auVar77._4_4_ * auVar76._4_4_;
                        auVar151._8_4_ = auVar77._8_4_ * auVar76._8_4_;
                        auVar151._12_4_ = auVar77._12_4_ * auVar76._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar151,auVar74,auVar75);
                        auVar75 = ZEXT416((uint)fVar246);
                        local_340 = vbroadcastss_avx512f(auVar75);
                        auVar165 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar165 = vpermps_avx512f(auVar165,ZEXT1664(auVar74));
                        auVar215 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar215,ZEXT1664(auVar74));
                        local_380 = vbroadcastss_avx512f(auVar74);
                        local_400[0] = (RTCHitN)auVar165[0];
                        local_400[1] = (RTCHitN)auVar165[1];
                        local_400[2] = (RTCHitN)auVar165[2];
                        local_400[3] = (RTCHitN)auVar165[3];
                        local_400[4] = (RTCHitN)auVar165[4];
                        local_400[5] = (RTCHitN)auVar165[5];
                        local_400[6] = (RTCHitN)auVar165[6];
                        local_400[7] = (RTCHitN)auVar165[7];
                        local_400[8] = (RTCHitN)auVar165[8];
                        local_400[9] = (RTCHitN)auVar165[9];
                        local_400[10] = (RTCHitN)auVar165[10];
                        local_400[0xb] = (RTCHitN)auVar165[0xb];
                        local_400[0xc] = (RTCHitN)auVar165[0xc];
                        local_400[0xd] = (RTCHitN)auVar165[0xd];
                        local_400[0xe] = (RTCHitN)auVar165[0xe];
                        local_400[0xf] = (RTCHitN)auVar165[0xf];
                        local_400[0x10] = (RTCHitN)auVar165[0x10];
                        local_400[0x11] = (RTCHitN)auVar165[0x11];
                        local_400[0x12] = (RTCHitN)auVar165[0x12];
                        local_400[0x13] = (RTCHitN)auVar165[0x13];
                        local_400[0x14] = (RTCHitN)auVar165[0x14];
                        local_400[0x15] = (RTCHitN)auVar165[0x15];
                        local_400[0x16] = (RTCHitN)auVar165[0x16];
                        local_400[0x17] = (RTCHitN)auVar165[0x17];
                        local_400[0x18] = (RTCHitN)auVar165[0x18];
                        local_400[0x19] = (RTCHitN)auVar165[0x19];
                        local_400[0x1a] = (RTCHitN)auVar165[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar165[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar165[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar165[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar165[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar165[0x1f];
                        local_400[0x20] = (RTCHitN)auVar165[0x20];
                        local_400[0x21] = (RTCHitN)auVar165[0x21];
                        local_400[0x22] = (RTCHitN)auVar165[0x22];
                        local_400[0x23] = (RTCHitN)auVar165[0x23];
                        local_400[0x24] = (RTCHitN)auVar165[0x24];
                        local_400[0x25] = (RTCHitN)auVar165[0x25];
                        local_400[0x26] = (RTCHitN)auVar165[0x26];
                        local_400[0x27] = (RTCHitN)auVar165[0x27];
                        local_400[0x28] = (RTCHitN)auVar165[0x28];
                        local_400[0x29] = (RTCHitN)auVar165[0x29];
                        local_400[0x2a] = (RTCHitN)auVar165[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar165[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar165[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar165[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar165[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar165[0x2f];
                        local_400[0x30] = (RTCHitN)auVar165[0x30];
                        local_400[0x31] = (RTCHitN)auVar165[0x31];
                        local_400[0x32] = (RTCHitN)auVar165[0x32];
                        local_400[0x33] = (RTCHitN)auVar165[0x33];
                        local_400[0x34] = (RTCHitN)auVar165[0x34];
                        local_400[0x35] = (RTCHitN)auVar165[0x35];
                        local_400[0x36] = (RTCHitN)auVar165[0x36];
                        local_400[0x37] = (RTCHitN)auVar165[0x37];
                        local_400[0x38] = (RTCHitN)auVar165[0x38];
                        local_400[0x39] = (RTCHitN)auVar165[0x39];
                        local_400[0x3a] = (RTCHitN)auVar165[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar165[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar165[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar165[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar165[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar165[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_440._0_8_;
                        uStack_2b8 = local_440._8_8_;
                        uStack_2b0 = local_440._16_8_;
                        uStack_2a8 = local_440._24_8_;
                        uStack_2a0 = local_440._32_8_;
                        uStack_298 = local_440._40_8_;
                        uStack_290 = local_440._48_8_;
                        uStack_288 = local_440._56_8_;
                        auVar165 = vmovdqa64_avx512f(local_480);
                        local_280 = vmovdqa64_avx512f(auVar165);
                        vpcmpeqd_avx2(auVar165._0_32_,auVar165._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar237;
                        local_6c0 = local_4c0;
                        local_970.valid = (int *)local_6c0;
                        local_970.geometryUserPtr = pGVar4->userPtr;
                        local_970.context = context->user;
                        local_970.hit = local_400;
                        local_970.N = 0x10;
                        local_970.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->occlusionFilterN)(&local_970);
                          auVar255 = ZEXT1664(auVar75);
                          auVar219._8_4_ = 0x7fffffff;
                          auVar219._0_8_ = 0x7fffffff7fffffff;
                          auVar219._12_4_ = 0x7fffffff;
                          auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        }
                        auVar165 = vmovdqa64_avx512f(local_6c0);
                        uVar21 = vptestmd_avx512f(auVar165,auVar165);
                        if ((short)uVar21 == 0) {
                          bVar66 = false;
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_970);
                            auVar255 = ZEXT1664(auVar75);
                            auVar219._8_4_ = 0x7fffffff;
                            auVar219._0_8_ = 0x7fffffff7fffffff;
                            auVar219._12_4_ = 0x7fffffff;
                            auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          }
                          auVar165 = vmovdqa64_avx512f(local_6c0);
                          uVar71 = vptestmd_avx512f(auVar165,auVar165);
                          auVar165 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar69 = (bool)((byte)uVar71 & 1);
                          auVar244._0_4_ =
                               (uint)bVar69 * auVar165._0_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x200);
                          bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
                          auVar244._4_4_ =
                               (uint)bVar69 * auVar165._4_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x204);
                          bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
                          auVar244._8_4_ =
                               (uint)bVar69 * auVar165._8_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x208);
                          bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
                          auVar244._12_4_ =
                               (uint)bVar69 * auVar165._12_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x20c);
                          bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
                          auVar244._16_4_ =
                               (uint)bVar69 * auVar165._16_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x210);
                          bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
                          auVar244._20_4_ =
                               (uint)bVar69 * auVar165._20_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x214);
                          bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
                          auVar244._24_4_ =
                               (uint)bVar69 * auVar165._24_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x218);
                          bVar69 = (bool)((byte)(uVar71 >> 7) & 1);
                          auVar244._28_4_ =
                               (uint)bVar69 * auVar165._28_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x21c);
                          bVar69 = (bool)((byte)(uVar71 >> 8) & 1);
                          auVar244._32_4_ =
                               (uint)bVar69 * auVar165._32_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x220);
                          bVar69 = (bool)((byte)(uVar71 >> 9) & 1);
                          auVar244._36_4_ =
                               (uint)bVar69 * auVar165._36_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x224);
                          bVar69 = (bool)((byte)(uVar71 >> 10) & 1);
                          auVar244._40_4_ =
                               (uint)bVar69 * auVar165._40_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x228);
                          bVar69 = (bool)((byte)(uVar71 >> 0xb) & 1);
                          auVar244._44_4_ =
                               (uint)bVar69 * auVar165._44_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x22c);
                          bVar69 = (bool)((byte)(uVar71 >> 0xc) & 1);
                          auVar244._48_4_ =
                               (uint)bVar69 * auVar165._48_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x230);
                          bVar69 = (bool)((byte)(uVar71 >> 0xd) & 1);
                          auVar244._52_4_ =
                               (uint)bVar69 * auVar165._52_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x234);
                          bVar69 = (bool)((byte)(uVar71 >> 0xe) & 1);
                          auVar244._56_4_ =
                               (uint)bVar69 * auVar165._56_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x238);
                          bVar69 = SUB81(uVar71 >> 0xf,0);
                          auVar244._60_4_ =
                               (uint)bVar69 * auVar165._60_4_ |
                               (uint)!bVar69 * *(int *)(local_970.ray + 0x23c);
                          *(undefined1 (*) [64])(local_970.ray + 0x200) = auVar244;
                          bVar66 = (short)uVar71 != 0;
                        }
                        if ((bool)bVar66 == false) {
                          *(float *)(ray + k * 4 + 0x200) = fVar239;
                        }
                      }
                      bVar69 = false;
                      goto LAB_01edf04f;
                    }
                  }
                  bVar69 = false;
                  bVar66 = 0;
                }
              }
LAB_01edf04f:
              if (!bVar69) goto LAB_01edf48f;
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
            bVar66 = 0;
LAB_01edf48f:
            bVar65 = bVar65 | bVar66 & 1;
            auVar51._4_4_ = fStack_65c;
            auVar51._0_4_ = local_660;
            auVar51._8_4_ = fStack_658;
            auVar51._12_4_ = fStack_654;
            auVar51._16_4_ = fStack_650;
            auVar51._20_4_ = fStack_64c;
            auVar51._24_4_ = fStack_648;
            auVar51._28_4_ = fStack_644;
            uVar229 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar34._4_4_ = uVar229;
            auVar34._0_4_ = uVar229;
            auVar34._8_4_ = uVar229;
            auVar34._12_4_ = uVar229;
            auVar34._16_4_ = uVar229;
            auVar34._20_4_ = uVar229;
            auVar34._24_4_ = uVar229;
            auVar34._28_4_ = uVar229;
            uVar21 = vcmpps_avx512vl(auVar51,auVar34,2);
            bVar63 = bVar55 & bVar63 & (byte)uVar21;
          } while (bVar63 != 0);
        }
        auVar161._0_4_ = (float)local_6e0._0_4_ + (float)local_680._0_4_;
        auVar161._4_4_ = (float)local_6e0._4_4_ + (float)local_680._4_4_;
        auVar161._8_4_ = fStack_6d8 + fStack_678;
        auVar161._12_4_ = fStack_6d4 + fStack_674;
        auVar161._16_4_ = fStack_6d0 + fStack_670;
        auVar161._20_4_ = fStack_6cc + fStack_66c;
        auVar161._24_4_ = fStack_6c8 + fStack_668;
        auVar161._28_4_ = fStack_6c4 + fStack_664;
        uVar229 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar35._4_4_ = uVar229;
        auVar35._0_4_ = uVar229;
        auVar35._8_4_ = uVar229;
        auVar35._12_4_ = uVar229;
        auVar35._16_4_ = uVar229;
        auVar35._20_4_ = uVar229;
        auVar35._24_4_ = uVar229;
        auVar35._28_4_ = uVar229;
        uVar21 = vcmpps_avx512vl(auVar161,auVar35,2);
        bVar64 = (byte)uVar19 | ~bVar64;
        bVar54 = (byte)uVar20 & bVar54 & (byte)uVar21;
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar82 = vpblendmd_avx512vl(auVar162,auVar36);
        local_680._0_4_ = (uint)(bVar64 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar69 = (bool)(bVar64 >> 1 & 1);
        local_680._4_4_ = (uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 2 & 1);
        fStack_678 = (float)((uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar64 >> 3 & 1);
        fStack_674 = (float)((uint)bVar69 * auVar82._12_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar64 >> 4 & 1);
        fStack_670 = (float)((uint)bVar69 * auVar82._16_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar64 >> 5 & 1);
        fStack_66c = (float)((uint)bVar69 * auVar82._20_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar64 >> 6 & 1);
        fStack_668 = (float)((uint)bVar69 * auVar82._24_4_ | (uint)!bVar69 * 2);
        fStack_664 = (float)((uint)(bVar64 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2);
        uVar19 = vpcmpd_avx512vl(_local_680,local_600,2);
        bVar64 = (byte)uVar19 & bVar54;
        if (bVar64 == 0) {
          auVar223 = ZEXT3264(local_940);
          auVar255 = ZEXT3264(auVar124);
          auVar244 = ZEXT3264(local_8e0);
        }
        else {
          auVar75 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar74 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar76 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar77 = vminps_avx(auVar75,auVar76);
          auVar75 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar76 = vmaxps_avx(auVar74,auVar75);
          auVar74 = vandps_avx(auVar77,auVar219);
          auVar75 = vandps_avx(auVar76,auVar219);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar230 = auVar74._0_4_ * 1.9073486e-06;
          local_880 = vshufps_avx(auVar76,auVar76,0xff);
          _local_760 = _local_5c0;
          local_660 = (float)local_6e0._0_4_ + (float)local_5c0._0_4_;
          fStack_65c = (float)local_6e0._4_4_ + (float)local_5c0._4_4_;
          fStack_658 = fStack_6d8 + fStack_5b8;
          fStack_654 = fStack_6d4 + fStack_5b4;
          fStack_650 = fStack_6d0 + fStack_5b0;
          fStack_64c = fStack_6cc + fStack_5ac;
          fStack_648 = fStack_6c8 + fStack_5a8;
          fStack_644 = fStack_6c4 + fStack_5a4;
          do {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar82 = vblendmps_avx512vl(auVar163,_local_760);
            auVar136._0_4_ =
                 (uint)(bVar64 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar69 * auVar82._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar69 * auVar82._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar69 * auVar82._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar136._24_4_ =
                 (uint)(bVar64 >> 6) * auVar82._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar82 = vshufps_avx(auVar136,auVar136,0xb1);
            auVar82 = vminps_avx(auVar136,auVar82);
            auVar96 = vshufpd_avx(auVar82,auVar82,5);
            auVar82 = vminps_avx(auVar82,auVar96);
            auVar96 = vpermpd_avx2(auVar82,0x4e);
            auVar82 = vminps_avx(auVar82,auVar96);
            uVar19 = vcmpps_avx512vl(auVar136,auVar82,0);
            bVar66 = (byte)uVar19 & bVar64;
            bVar63 = bVar64;
            if (bVar66 != 0) {
              bVar63 = bVar66;
            }
            iVar22 = 0;
            for (uVar56 = (uint)bVar63; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            bVar63 = '\x01' << ((byte)iVar22 & 0x1f);
            uVar56 = *(uint *)(local_640 + (uint)(iVar22 << 2));
            fVar237 = *(float *)(local_5a0 + (uint)(iVar22 << 2));
            fVar238 = auVar72._0_4_;
            if ((float)local_900._0_4_ < 0.0) {
              fVar238 = sqrtf((float)local_900._0_4_);
            }
            auVar165 = ZEXT464(uVar56);
            bVar66 = ~bVar63;
            lVar67 = 5;
            do {
              auVar152._4_4_ = fVar237;
              auVar152._0_4_ = fVar237;
              auVar152._8_4_ = fVar237;
              auVar152._12_4_ = fVar237;
              auVar75 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_8f0);
              fVar246 = auVar165._0_4_;
              fVar239 = 1.0 - fVar246;
              auVar197._0_4_ = local_7c0._0_4_ * fVar246;
              auVar197._4_4_ = local_7c0._4_4_ * fVar246;
              auVar197._8_4_ = local_7c0._8_4_ * fVar246;
              auVar197._12_4_ = local_7c0._12_4_ * fVar246;
              local_820 = ZEXT416((uint)fVar239);
              auVar212._4_4_ = fVar239;
              auVar212._0_4_ = fVar239;
              auVar212._8_4_ = fVar239;
              auVar212._12_4_ = fVar239;
              auVar74 = vfmadd231ps_fma(auVar197,auVar212,local_780._0_16_);
              auVar220._0_4_ = local_7a0._0_4_ * fVar246;
              auVar220._4_4_ = local_7a0._4_4_ * fVar246;
              auVar220._8_4_ = local_7a0._8_4_ * fVar246;
              auVar220._12_4_ = local_7a0._12_4_ * fVar246;
              auVar76 = vfmadd231ps_fma(auVar220,auVar212,local_7c0._0_16_);
              auVar227._0_4_ = fVar246 * (float)local_7e0._0_4_;
              auVar227._4_4_ = fVar246 * (float)local_7e0._4_4_;
              auVar227._8_4_ = fVar246 * fStack_7d8;
              auVar227._12_4_ = fVar246 * fStack_7d4;
              auVar77 = vfmadd231ps_fma(auVar227,auVar212,local_7a0._0_16_);
              auVar235._0_4_ = fVar246 * auVar76._0_4_;
              auVar235._4_4_ = fVar246 * auVar76._4_4_;
              auVar235._8_4_ = fVar246 * auVar76._8_4_;
              auVar235._12_4_ = fVar246 * auVar76._12_4_;
              auVar74 = vfmadd231ps_fma(auVar235,auVar212,auVar74);
              auVar198._0_4_ = fVar246 * auVar77._0_4_;
              auVar198._4_4_ = fVar246 * auVar77._4_4_;
              auVar198._8_4_ = fVar246 * auVar77._8_4_;
              auVar198._12_4_ = fVar246 * auVar77._12_4_;
              auVar76 = vfmadd231ps_fma(auVar198,auVar212,auVar76);
              auVar221._0_4_ = fVar246 * auVar76._0_4_;
              auVar221._4_4_ = fVar246 * auVar76._4_4_;
              auVar221._8_4_ = fVar246 * auVar76._8_4_;
              auVar221._12_4_ = fVar246 * auVar76._12_4_;
              auVar77 = vfmadd231ps_fma(auVar221,auVar74,auVar212);
              auVar74 = vsubps_avx(auVar76,auVar74);
              auVar26._8_4_ = 0x40400000;
              auVar26._0_8_ = 0x4040000040400000;
              auVar26._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar74,auVar26);
              local_740._0_16_ = auVar77;
              auVar74 = vsubps_avx(auVar75,auVar77);
              local_920._0_16_ = auVar74;
              auVar74 = vdpps_avx(auVar74,auVar74,0x7f);
              local_8c0._0_16_ = auVar74;
              if (auVar74._0_4_ < 0.0) {
                auVar139._0_4_ = sqrtf(auVar74._0_4_);
                auVar139._4_60_ = extraout_var_01;
                auVar74 = auVar139._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar74,auVar74);
              }
              local_830 = vdpps_avx(auVar76,auVar76,0x7f);
              fVar239 = local_830._0_4_;
              auVar199._4_12_ = ZEXT812(0) << 0x20;
              auVar199._0_4_ = fVar239;
              auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
              fVar240 = auVar75._0_4_;
              local_840 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_830,auVar27);
              auVar75 = vfnmadd213ss_fma(local_840,local_830,ZEXT416(0x40000000));
              uVar56 = auVar74._0_4_;
              if (fVar239 < auVar77._0_4_) {
                auVar166._0_4_ = sqrtf(fVar239);
                auVar166._4_60_ = extraout_var_02;
                auVar74 = ZEXT416(uVar56);
                auVar77 = auVar166._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx512f(local_830,local_830);
              }
              fVar239 = fVar240 * 1.5 + fVar239 * -0.5 * fVar240 * fVar240 * fVar240;
              local_850._0_4_ = auVar76._0_4_ * fVar239;
              local_850._4_4_ = auVar76._4_4_ * fVar239;
              local_850._8_4_ = auVar76._8_4_ * fVar239;
              local_850._12_4_ = auVar76._12_4_ * fVar239;
              auVar2 = vdpps_avx(local_920._0_16_,local_850,0x7f);
              auVar78 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
              auVar153._0_4_ = auVar2._0_4_ * auVar2._0_4_;
              auVar153._4_4_ = auVar2._4_4_ * auVar2._4_4_;
              auVar153._8_4_ = auVar2._8_4_ * auVar2._8_4_;
              auVar153._12_4_ = auVar2._12_4_ * auVar2._12_4_;
              auVar73 = vsubps_avx(local_8c0._0_16_,auVar153);
              fVar240 = auVar73._0_4_;
              auVar175._4_12_ = ZEXT812(0) << 0x20;
              auVar175._0_4_ = fVar240;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar175);
              fVar241 = auVar79._0_4_;
              uVar70 = fVar240 == 0.0;
              uVar68 = fVar240 < 0.0;
              if ((bool)uVar68) {
                local_860 = fVar239;
                fStack_85c = fVar239;
                fStack_858 = fVar239;
                fStack_854 = fVar239;
                fVar242 = sqrtf(fVar240);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar74 = ZEXT416(uVar56);
                auVar78 = ZEXT416(auVar78._0_4_);
                fVar239 = local_860;
                fVar208 = fStack_85c;
                fVar250 = fStack_858;
                fVar251 = fStack_854;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                fVar242 = auVar73._0_4_;
                fVar208 = fVar239;
                fVar250 = fVar239;
                fVar251 = fVar239;
              }
              auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar255 = ZEXT3264(auVar82);
              auVar244 = ZEXT3264(local_8e0);
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar165._0_16_,local_820);
              fVar167 = auVar73._0_4_ * 6.0;
              fVar18 = fVar246 * 6.0;
              auVar200._0_4_ = fVar18 * (float)local_7e0._0_4_;
              auVar200._4_4_ = fVar18 * (float)local_7e0._4_4_;
              auVar200._8_4_ = fVar18 * fStack_7d8;
              auVar200._12_4_ = fVar18 * fStack_7d4;
              auVar176._4_4_ = fVar167;
              auVar176._0_4_ = fVar167;
              auVar176._8_4_ = fVar167;
              auVar176._12_4_ = fVar167;
              auVar73 = vfmadd132ps_fma(auVar176,auVar200,local_7a0._0_16_);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820,auVar165._0_16_);
              fVar167 = auVar79._0_4_ * 6.0;
              auVar201._4_4_ = fVar167;
              auVar201._0_4_ = fVar167;
              auVar201._8_4_ = fVar167;
              auVar201._12_4_ = fVar167;
              auVar73 = vfmadd132ps_fma(auVar201,auVar73,local_7c0._0_16_);
              fVar167 = local_820._0_4_ * 6.0;
              auVar177._4_4_ = fVar167;
              auVar177._0_4_ = fVar167;
              auVar177._8_4_ = fVar167;
              auVar177._12_4_ = fVar167;
              auVar73 = vfmadd132ps_fma(auVar177,auVar73,local_780._0_16_);
              auVar202._0_4_ = auVar73._0_4_ * (float)local_830._0_4_;
              auVar202._4_4_ = auVar73._4_4_ * (float)local_830._0_4_;
              auVar202._8_4_ = auVar73._8_4_ * (float)local_830._0_4_;
              auVar202._12_4_ = auVar73._12_4_ * (float)local_830._0_4_;
              auVar73 = vdpps_avx(auVar76,auVar73,0x7f);
              fVar167 = auVar73._0_4_;
              auVar178._0_4_ = auVar76._0_4_ * fVar167;
              auVar178._4_4_ = auVar76._4_4_ * fVar167;
              auVar178._8_4_ = auVar76._8_4_ * fVar167;
              auVar178._12_4_ = auVar76._12_4_ * fVar167;
              auVar79 = vsubps_avx(auVar202,auVar178);
              fVar167 = auVar75._0_4_ * (float)local_840._0_4_;
              auVar73 = vmaxss_avx(ZEXT416((uint)fVar230),
                                   ZEXT416((uint)(fVar237 * fVar238 * 1.9073486e-06)));
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar76,auVar28);
              auVar203._0_4_ = fVar239 * auVar79._0_4_ * fVar167;
              auVar203._4_4_ = fVar208 * auVar79._4_4_ * fVar167;
              auVar203._8_4_ = fVar250 * auVar79._8_4_ * fVar167;
              auVar203._12_4_ = fVar251 * auVar79._12_4_ * fVar167;
              auVar75 = vdpps_avx(auVar80,local_850,0x7f);
              auVar79 = vdivss_avx512f(ZEXT416((uint)fVar230),auVar77);
              auVar77 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar230),auVar73);
              auVar74 = vdpps_avx(local_920._0_16_,auVar203,0x7f);
              vfmadd213ss_avx512f(auVar78,auVar79,auVar77);
              fVar239 = auVar75._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_8f0,local_850,0x7f);
              auVar75 = vdpps_avx(local_920._0_16_,auVar80,0x7f);
              fVar240 = fVar241 * fVar240 * -0.5 * fVar241 * fVar241 + fVar241 * 1.5;
              auVar77 = vdpps_avx(local_920._0_16_,local_8f0,0x7f);
              in_ZMM31 = ZEXT1664(auVar2);
              auVar78 = vfnmadd231ss_avx512f(auVar75,auVar2,ZEXT416((uint)fVar239));
              auVar79 = vfnmadd231ss_avx512f(auVar77,auVar2,auVar74);
              auVar75 = vpermilps_avx(local_740._0_16_,0xff);
              fVar242 = fVar242 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar76,auVar76,0xff);
              auVar77 = vfmsub213ss_fma(auVar78,ZEXT416((uint)fVar240),auVar75);
              fVar240 = auVar79._0_4_ * fVar240;
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar77._0_4_)),
                                        ZEXT416((uint)fVar239),ZEXT416((uint)fVar240));
              fVar241 = auVar78._0_4_;
              auVar236._0_4_ = fVar240 / fVar241;
              auVar236._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar213._0_4_ = auVar77._0_4_ / fVar241;
              auVar213._4_12_ = auVar77._4_12_;
              auVar77 = vmulss_avx512f(auVar2,auVar236);
              auVar78 = vmulss_avx512f(auVar2,auVar213);
              fVar246 = fVar246 - (auVar77._0_4_ - fVar242 * (auVar74._0_4_ / fVar241));
              auVar165 = ZEXT464((uint)fVar246);
              fVar237 = fVar237 - (fVar242 * (fVar239 / fVar241) - auVar78._0_4_);
              auVar222._8_4_ = 0x7fffffff;
              auVar222._0_8_ = 0x7fffffff7fffffff;
              auVar222._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(auVar2,auVar222);
              auVar74 = vucomiss_avx512f(auVar74);
              bVar69 = true;
              if ((bool)uVar68 || (bool)uVar70) {
LAB_01edfc90:
                auVar223 = ZEXT3264(local_940);
              }
              else {
                auVar74 = vaddss_avx512f(auVar73,auVar74);
                auVar77 = vfmadd231ss_fma(auVar74,local_880,ZEXT416(0x36000000));
                auVar74 = vandps_avx(ZEXT416((uint)fVar242),auVar222);
                if (auVar77._0_4_ <= auVar74._0_4_) goto LAB_01edfc90;
                fVar237 = fVar237 + (float)local_870._0_4_;
                auVar223 = ZEXT3264(local_940);
                if ((((fVar237 < fVar148) ||
                     (fVar239 = *(float *)(ray + k * 4 + 0x200), fVar239 < fVar237)) ||
                    (fVar246 < 0.0)) || (1.0 < fVar246)) {
LAB_01edfc8b:
                  bVar69 = false;
                  bVar63 = 0;
                }
                else {
                  auVar50._12_4_ = 0;
                  auVar50._0_12_ = ZEXT812(0);
                  auVar74 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)local_8c0._0_4_));
                  fVar240 = auVar74._0_4_;
                  pGVar4 = (context->scene->geometries).items[uVar58].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01edfc8b;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar63 = true;
                  }
                  else {
                    fVar240 = fVar240 * 1.5 +
                              (float)local_8c0._0_4_ * -0.5 * fVar240 * fVar240 * fVar240;
                    auVar179._0_4_ = local_920._0_4_ * fVar240;
                    auVar179._4_4_ = local_920._4_4_ * fVar240;
                    auVar179._8_4_ = local_920._8_4_ * fVar240;
                    auVar179._12_4_ = local_920._12_4_ * fVar240;
                    auVar77 = vfmadd213ps_fma(auVar75,auVar179,auVar76);
                    auVar74 = vshufps_avx(auVar179,auVar179,0xc9);
                    auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar180._0_4_ = auVar179._0_4_ * auVar75._0_4_;
                    auVar180._4_4_ = auVar179._4_4_ * auVar75._4_4_;
                    auVar180._8_4_ = auVar179._8_4_ * auVar75._8_4_;
                    auVar180._12_4_ = auVar179._12_4_ * auVar75._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar180,auVar76,auVar74);
                    auVar74 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar75 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                    auVar154._0_4_ = auVar77._0_4_ * auVar76._0_4_;
                    auVar154._4_4_ = auVar77._4_4_ * auVar76._4_4_;
                    auVar154._8_4_ = auVar77._8_4_ * auVar76._8_4_;
                    auVar154._12_4_ = auVar77._12_4_ * auVar76._12_4_;
                    auVar74 = vfmsub231ps_fma(auVar154,auVar74,auVar75);
                    auVar75 = ZEXT416((uint)fVar246);
                    local_340 = vbroadcastss_avx512f(auVar75);
                    auVar215 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar215 = vpermps_avx512f(auVar215,ZEXT1664(auVar74));
                    auVar139 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar139,ZEXT1664(auVar74));
                    local_380 = vbroadcastss_avx512f(auVar74);
                    local_400[0] = (RTCHitN)auVar215[0];
                    local_400[1] = (RTCHitN)auVar215[1];
                    local_400[2] = (RTCHitN)auVar215[2];
                    local_400[3] = (RTCHitN)auVar215[3];
                    local_400[4] = (RTCHitN)auVar215[4];
                    local_400[5] = (RTCHitN)auVar215[5];
                    local_400[6] = (RTCHitN)auVar215[6];
                    local_400[7] = (RTCHitN)auVar215[7];
                    local_400[8] = (RTCHitN)auVar215[8];
                    local_400[9] = (RTCHitN)auVar215[9];
                    local_400[10] = (RTCHitN)auVar215[10];
                    local_400[0xb] = (RTCHitN)auVar215[0xb];
                    local_400[0xc] = (RTCHitN)auVar215[0xc];
                    local_400[0xd] = (RTCHitN)auVar215[0xd];
                    local_400[0xe] = (RTCHitN)auVar215[0xe];
                    local_400[0xf] = (RTCHitN)auVar215[0xf];
                    local_400[0x10] = (RTCHitN)auVar215[0x10];
                    local_400[0x11] = (RTCHitN)auVar215[0x11];
                    local_400[0x12] = (RTCHitN)auVar215[0x12];
                    local_400[0x13] = (RTCHitN)auVar215[0x13];
                    local_400[0x14] = (RTCHitN)auVar215[0x14];
                    local_400[0x15] = (RTCHitN)auVar215[0x15];
                    local_400[0x16] = (RTCHitN)auVar215[0x16];
                    local_400[0x17] = (RTCHitN)auVar215[0x17];
                    local_400[0x18] = (RTCHitN)auVar215[0x18];
                    local_400[0x19] = (RTCHitN)auVar215[0x19];
                    local_400[0x1a] = (RTCHitN)auVar215[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar215[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar215[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar215[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar215[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar215[0x1f];
                    local_400[0x20] = (RTCHitN)auVar215[0x20];
                    local_400[0x21] = (RTCHitN)auVar215[0x21];
                    local_400[0x22] = (RTCHitN)auVar215[0x22];
                    local_400[0x23] = (RTCHitN)auVar215[0x23];
                    local_400[0x24] = (RTCHitN)auVar215[0x24];
                    local_400[0x25] = (RTCHitN)auVar215[0x25];
                    local_400[0x26] = (RTCHitN)auVar215[0x26];
                    local_400[0x27] = (RTCHitN)auVar215[0x27];
                    local_400[0x28] = (RTCHitN)auVar215[0x28];
                    local_400[0x29] = (RTCHitN)auVar215[0x29];
                    local_400[0x2a] = (RTCHitN)auVar215[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar215[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar215[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar215[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar215[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar215[0x2f];
                    local_400[0x30] = (RTCHitN)auVar215[0x30];
                    local_400[0x31] = (RTCHitN)auVar215[0x31];
                    local_400[0x32] = (RTCHitN)auVar215[0x32];
                    local_400[0x33] = (RTCHitN)auVar215[0x33];
                    local_400[0x34] = (RTCHitN)auVar215[0x34];
                    local_400[0x35] = (RTCHitN)auVar215[0x35];
                    local_400[0x36] = (RTCHitN)auVar215[0x36];
                    local_400[0x37] = (RTCHitN)auVar215[0x37];
                    local_400[0x38] = (RTCHitN)auVar215[0x38];
                    local_400[0x39] = (RTCHitN)auVar215[0x39];
                    local_400[0x3a] = (RTCHitN)auVar215[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar215[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar215[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar215[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar215[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar215[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_440._0_8_;
                    uStack_2b8 = local_440._8_8_;
                    uStack_2b0 = local_440._16_8_;
                    uStack_2a8 = local_440._24_8_;
                    uStack_2a0 = local_440._32_8_;
                    uStack_298 = local_440._40_8_;
                    uStack_290 = local_440._48_8_;
                    uStack_288 = local_440._56_8_;
                    auVar215 = vmovdqa64_avx512f(local_480);
                    local_280 = vmovdqa64_avx512f(auVar215);
                    vpcmpeqd_avx2(auVar215._0_32_,auVar215._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar237;
                    local_6c0 = local_4c0;
                    local_970.valid = (int *)local_6c0;
                    local_970.geometryUserPtr = pGVar4->userPtr;
                    local_970.context = context->user;
                    local_970.hit = local_400;
                    local_970.N = 0x10;
                    local_970.ray = (RTCRayN *)ray;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&local_970);
                      auVar165 = ZEXT1664(auVar75);
                      auVar223 = ZEXT3264(local_940);
                      auVar244 = ZEXT3264(local_8e0);
                      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar255 = ZEXT3264(auVar82);
                    }
                    auVar215 = vmovdqa64_avx512f(local_6c0);
                    uVar19 = vptestmd_avx512f(auVar215,auVar215);
                    if ((short)uVar19 == 0) {
                      bVar63 = false;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_970);
                        auVar165 = ZEXT1664(auVar75);
                        auVar223 = ZEXT3264(local_940);
                        auVar244 = ZEXT3264(local_8e0);
                        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar255 = ZEXT3264(auVar82);
                      }
                      auVar215 = vmovdqa64_avx512f(local_6c0);
                      uVar71 = vptestmd_avx512f(auVar215,auVar215);
                      auVar215 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar69 = (bool)((byte)uVar71 & 1);
                      auVar140._0_4_ =
                           (uint)bVar69 * auVar215._0_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x200);
                      bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
                      auVar140._4_4_ =
                           (uint)bVar69 * auVar215._4_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x204);
                      bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
                      auVar140._8_4_ =
                           (uint)bVar69 * auVar215._8_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x208);
                      bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
                      auVar140._12_4_ =
                           (uint)bVar69 * auVar215._12_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x20c);
                      bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
                      auVar140._16_4_ =
                           (uint)bVar69 * auVar215._16_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x210);
                      bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
                      auVar140._20_4_ =
                           (uint)bVar69 * auVar215._20_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x214);
                      bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
                      auVar140._24_4_ =
                           (uint)bVar69 * auVar215._24_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x218);
                      bVar69 = (bool)((byte)(uVar71 >> 7) & 1);
                      auVar140._28_4_ =
                           (uint)bVar69 * auVar215._28_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x21c);
                      bVar69 = (bool)((byte)(uVar71 >> 8) & 1);
                      auVar140._32_4_ =
                           (uint)bVar69 * auVar215._32_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x220);
                      bVar69 = (bool)((byte)(uVar71 >> 9) & 1);
                      auVar140._36_4_ =
                           (uint)bVar69 * auVar215._36_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x224);
                      bVar69 = (bool)((byte)(uVar71 >> 10) & 1);
                      auVar140._40_4_ =
                           (uint)bVar69 * auVar215._40_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x228);
                      bVar69 = (bool)((byte)(uVar71 >> 0xb) & 1);
                      auVar140._44_4_ =
                           (uint)bVar69 * auVar215._44_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x22c);
                      bVar69 = (bool)((byte)(uVar71 >> 0xc) & 1);
                      auVar140._48_4_ =
                           (uint)bVar69 * auVar215._48_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x230);
                      bVar69 = (bool)((byte)(uVar71 >> 0xd) & 1);
                      auVar140._52_4_ =
                           (uint)bVar69 * auVar215._52_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x234);
                      bVar69 = (bool)((byte)(uVar71 >> 0xe) & 1);
                      auVar140._56_4_ =
                           (uint)bVar69 * auVar215._56_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x238);
                      bVar69 = SUB81(uVar71 >> 0xf,0);
                      auVar140._60_4_ =
                           (uint)bVar69 * auVar215._60_4_ |
                           (uint)!bVar69 * *(int *)(local_970.ray + 0x23c);
                      *(undefined1 (*) [64])(local_970.ray + 0x200) = auVar140;
                      bVar63 = (short)uVar71 != 0;
                    }
                    if ((bool)bVar63 == false) {
                      *(float *)(ray + k * 4 + 0x200) = fVar239;
                    }
                  }
                  bVar69 = false;
                }
              }
              if (!bVar69) goto LAB_01ee00e7;
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
            bVar63 = 0;
LAB_01ee00e7:
            bVar65 = bVar65 | bVar63 & 1;
            auVar52._4_4_ = fStack_65c;
            auVar52._0_4_ = local_660;
            auVar52._8_4_ = fStack_658;
            auVar52._12_4_ = fStack_654;
            auVar52._16_4_ = fStack_650;
            auVar52._20_4_ = fStack_64c;
            auVar52._24_4_ = fStack_648;
            auVar52._28_4_ = fStack_644;
            uVar229 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar37._4_4_ = uVar229;
            auVar37._0_4_ = uVar229;
            auVar37._8_4_ = uVar229;
            auVar37._12_4_ = uVar229;
            auVar37._16_4_ = uVar229;
            auVar37._20_4_ = uVar229;
            auVar37._24_4_ = uVar229;
            auVar37._28_4_ = uVar229;
            uVar19 = vcmpps_avx512vl(auVar52,auVar37,2);
            bVar64 = bVar66 & bVar64 & (byte)uVar19;
          } while (bVar64 != 0);
        }
        uVar21 = vpcmpd_avx512vl(local_600,_local_680,1);
        uVar20 = vpcmpd_avx512vl(local_600,local_580,1);
        auVar183._0_4_ = (float)local_6e0._0_4_ + (float)local_500._0_4_;
        auVar183._4_4_ = (float)local_6e0._4_4_ + (float)local_500._4_4_;
        auVar183._8_4_ = fStack_6d8 + fStack_4f8;
        auVar183._12_4_ = fStack_6d4 + fStack_4f4;
        auVar183._16_4_ = fStack_6d0 + fStack_4f0;
        auVar183._20_4_ = fStack_6cc + fStack_4ec;
        auVar183._24_4_ = fStack_6c8 + fStack_4e8;
        auVar183._28_4_ = fStack_6c4 + fStack_4e4;
        uVar229 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar207._4_4_ = uVar229;
        auVar207._0_4_ = uVar229;
        auVar207._8_4_ = uVar229;
        auVar207._12_4_ = uVar229;
        auVar207._16_4_ = uVar229;
        auVar207._20_4_ = uVar229;
        auVar207._24_4_ = uVar229;
        auVar207._28_4_ = uVar229;
        uVar19 = vcmpps_avx512vl(auVar183,auVar207,2);
        bVar57 = bVar57 & (byte)uVar20 & (byte)uVar19;
        auVar214._0_4_ = (float)local_6e0._0_4_ + local_5c0._0_4_;
        auVar214._4_4_ = (float)local_6e0._4_4_ + local_5c0._4_4_;
        auVar214._8_4_ = fStack_6d8 + local_5c0._8_4_;
        auVar214._12_4_ = fStack_6d4 + local_5c0._12_4_;
        auVar214._16_4_ = fStack_6d0 + local_5c0._16_4_;
        auVar214._20_4_ = fStack_6cc + local_5c0._20_4_;
        auVar214._24_4_ = fStack_6c8 + local_5c0._24_4_;
        auVar214._28_4_ = fStack_6c4 + local_5c0._28_4_;
        uVar19 = vcmpps_avx512vl(auVar214,auVar207,2);
        bVar54 = bVar54 & (byte)uVar21 & (byte)uVar19 | bVar57;
        if (bVar54 == 0) {
          auVar215 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar165 = ZEXT3264(local_800);
        }
        else {
          local_1a0[uVar59 * 0x60] = bVar54;
          auVar137._0_4_ =
               (uint)(bVar57 & 1) * local_500._0_4_ |
               (uint)!(bool)(bVar57 & 1) * (int)local_5c0._0_4_;
          bVar69 = (bool)(bVar57 >> 1 & 1);
          auVar137._4_4_ = (uint)bVar69 * local_500._4_4_ | (uint)!bVar69 * (int)local_5c0._4_4_;
          bVar69 = (bool)(bVar57 >> 2 & 1);
          auVar137._8_4_ = (uint)bVar69 * (int)fStack_4f8 | (uint)!bVar69 * (int)local_5c0._8_4_;
          bVar69 = (bool)(bVar57 >> 3 & 1);
          auVar137._12_4_ = (uint)bVar69 * (int)fStack_4f4 | (uint)!bVar69 * (int)local_5c0._12_4_;
          bVar69 = (bool)(bVar57 >> 4 & 1);
          auVar137._16_4_ = (uint)bVar69 * (int)fStack_4f0 | (uint)!bVar69 * (int)local_5c0._16_4_;
          bVar69 = (bool)(bVar57 >> 5 & 1);
          auVar137._20_4_ = (uint)bVar69 * (int)fStack_4ec | (uint)!bVar69 * (int)local_5c0._20_4_;
          auVar137._24_4_ =
               (uint)(bVar57 >> 6) * (int)fStack_4e8 |
               (uint)!(bool)(bVar57 >> 6) * (int)local_5c0._24_4_;
          auVar137._28_4_ = local_5c0._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar59 * 0x60) = auVar137;
          uVar19 = vmovlps_avx(local_890);
          *(undefined8 *)(local_160 + uVar59 * 0x18) = uVar19;
          local_158[uVar59 * 0x18] = iVar62 + 1;
          uVar59 = (ulong)((int)uVar59 + 1);
          auVar215 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar165 = ZEXT3264(local_800);
        }
      }
    }
    do {
      if ((int)uVar59 == 0) {
        if (bVar65 != 0) {
          return local_c41;
        }
        uVar229 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar39._4_4_ = uVar229;
        auVar39._0_4_ = uVar229;
        auVar39._8_4_ = uVar229;
        auVar39._12_4_ = uVar229;
        auVar39._16_4_ = uVar229;
        auVar39._20_4_ = uVar229;
        auVar39._24_4_ = uVar229;
        auVar39._28_4_ = uVar229;
        uVar19 = vcmpps_avx512vl(local_560,auVar39,2);
        uVar58 = (uint)uVar19 & (uint)local_808 - 1 & (uint)local_808;
        local_808 = (ulong)uVar58;
        local_c41 = uVar58 != 0;
        if (!local_c41) {
          return local_c41;
        }
        goto LAB_01edda0a;
      }
      uVar71 = (ulong)((int)uVar59 - 1);
      lVar67 = uVar71 * 0x60;
      auVar82 = *(undefined1 (*) [32])(auStack_180 + lVar67);
      auVar184._0_4_ = auVar82._0_4_ + (float)local_6e0._0_4_;
      auVar184._4_4_ = auVar82._4_4_ + (float)local_6e0._4_4_;
      auVar184._8_4_ = auVar82._8_4_ + fStack_6d8;
      auVar184._12_4_ = auVar82._12_4_ + fStack_6d4;
      auVar184._16_4_ = auVar82._16_4_ + fStack_6d0;
      auVar184._20_4_ = auVar82._20_4_ + fStack_6cc;
      auVar184._24_4_ = auVar82._24_4_ + fStack_6c8;
      auVar184._28_4_ = auVar82._28_4_ + fStack_6c4;
      uVar229 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar38._4_4_ = uVar229;
      auVar38._0_4_ = uVar229;
      auVar38._8_4_ = uVar229;
      auVar38._12_4_ = uVar229;
      auVar38._16_4_ = uVar229;
      auVar38._20_4_ = uVar229;
      auVar38._24_4_ = uVar229;
      auVar38._28_4_ = uVar229;
      uVar19 = vcmpps_avx512vl(auVar184,auVar38,2);
      uVar56 = (uint)uVar19 & (uint)local_1a0[lVar67];
      bVar54 = (byte)uVar56;
      if (uVar56 != 0) {
        auVar185._8_4_ = 0x7f800000;
        auVar185._0_8_ = 0x7f8000007f800000;
        auVar185._12_4_ = 0x7f800000;
        auVar185._16_4_ = 0x7f800000;
        auVar185._20_4_ = 0x7f800000;
        auVar185._24_4_ = 0x7f800000;
        auVar185._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar185,auVar82);
        auVar138._0_4_ =
             (uint)(bVar54 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar54 & 1) * (int)auVar82._0_4_;
        bVar69 = (bool)((byte)(uVar56 >> 1) & 1);
        auVar138._4_4_ = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * (int)auVar82._4_4_;
        bVar69 = (bool)((byte)(uVar56 >> 2) & 1);
        auVar138._8_4_ = (uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * (int)auVar82._8_4_;
        bVar69 = (bool)((byte)(uVar56 >> 3) & 1);
        auVar138._12_4_ = (uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * (int)auVar82._12_4_;
        bVar69 = (bool)((byte)(uVar56 >> 4) & 1);
        auVar138._16_4_ = (uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * (int)auVar82._16_4_;
        bVar69 = (bool)((byte)(uVar56 >> 5) & 1);
        auVar138._20_4_ = (uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * (int)auVar82._20_4_;
        bVar69 = (bool)((byte)(uVar56 >> 6) & 1);
        auVar138._24_4_ = (uint)bVar69 * auVar96._24_4_ | (uint)!bVar69 * (int)auVar82._24_4_;
        auVar138._28_4_ =
             (uVar56 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar56 >> 7,0) * (int)auVar82._28_4_;
        auVar82 = vshufps_avx(auVar138,auVar138,0xb1);
        auVar82 = vminps_avx(auVar138,auVar82);
        auVar96 = vshufpd_avx(auVar82,auVar82,5);
        auVar82 = vminps_avx(auVar82,auVar96);
        auVar96 = vpermpd_avx2(auVar82,0x4e);
        auVar82 = vminps_avx(auVar82,auVar96);
        uVar19 = vcmpps_avx512vl(auVar138,auVar82,0);
        bVar64 = (byte)uVar19 & bVar54;
        if (bVar64 != 0) {
          uVar56 = (uint)bVar64;
        }
        fVar230 = local_160[uVar71 * 0x18 + 1];
        uVar141 = 0;
        for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
          uVar141 = uVar141 + 1;
        }
        iVar62 = local_158[uVar71 * 0x18];
        bVar64 = ~('\x01' << ((byte)uVar141 & 0x1f)) & bVar54;
        local_1a0[lVar67] = bVar64;
        auVar165 = ZEXT3264(local_800);
        uVar61 = uVar71;
        if (bVar64 != 0) {
          uVar61 = uVar59;
        }
        fVar237 = local_160[uVar71 * 0x18];
        auVar186._4_4_ = fVar237;
        auVar186._0_4_ = fVar237;
        auVar186._8_4_ = fVar237;
        auVar186._12_4_ = fVar237;
        auVar186._16_4_ = fVar237;
        auVar186._20_4_ = fVar237;
        auVar186._24_4_ = fVar237;
        auVar186._28_4_ = fVar237;
        fVar230 = fVar230 - fVar237;
        auVar164._4_4_ = fVar230;
        auVar164._0_4_ = fVar230;
        auVar164._8_4_ = fVar230;
        auVar164._12_4_ = fVar230;
        auVar164._16_4_ = fVar230;
        auVar164._20_4_ = fVar230;
        auVar164._24_4_ = fVar230;
        auVar164._28_4_ = fVar230;
        auVar74 = vfmadd132ps_fma(auVar164,auVar186,_DAT_02020f20);
        auVar82 = ZEXT1632(auVar74);
        local_400[0] = (RTCHitN)auVar82[0];
        local_400[1] = (RTCHitN)auVar82[1];
        local_400[2] = (RTCHitN)auVar82[2];
        local_400[3] = (RTCHitN)auVar82[3];
        local_400[4] = (RTCHitN)auVar82[4];
        local_400[5] = (RTCHitN)auVar82[5];
        local_400[6] = (RTCHitN)auVar82[6];
        local_400[7] = (RTCHitN)auVar82[7];
        local_400[8] = (RTCHitN)auVar82[8];
        local_400[9] = (RTCHitN)auVar82[9];
        local_400[10] = (RTCHitN)auVar82[10];
        local_400[0xb] = (RTCHitN)auVar82[0xb];
        local_400[0xc] = (RTCHitN)auVar82[0xc];
        local_400[0xd] = (RTCHitN)auVar82[0xd];
        local_400[0xe] = (RTCHitN)auVar82[0xe];
        local_400[0xf] = (RTCHitN)auVar82[0xf];
        local_400[0x10] = (RTCHitN)auVar82[0x10];
        local_400[0x11] = (RTCHitN)auVar82[0x11];
        local_400[0x12] = (RTCHitN)auVar82[0x12];
        local_400[0x13] = (RTCHitN)auVar82[0x13];
        local_400[0x14] = (RTCHitN)auVar82[0x14];
        local_400[0x15] = (RTCHitN)auVar82[0x15];
        local_400[0x16] = (RTCHitN)auVar82[0x16];
        local_400[0x17] = (RTCHitN)auVar82[0x17];
        local_400[0x18] = (RTCHitN)auVar82[0x18];
        local_400[0x19] = (RTCHitN)auVar82[0x19];
        local_400[0x1a] = (RTCHitN)auVar82[0x1a];
        local_400[0x1b] = (RTCHitN)auVar82[0x1b];
        local_400[0x1c] = (RTCHitN)auVar82[0x1c];
        local_400[0x1d] = (RTCHitN)auVar82[0x1d];
        local_400[0x1e] = (RTCHitN)auVar82[0x1e];
        local_400[0x1f] = (RTCHitN)auVar82[0x1f];
        local_890._8_8_ = 0;
        local_890._0_8_ = *(ulong *)(local_400 + (ulong)uVar141 * 4);
        uVar71 = uVar61;
      }
      uVar59 = uVar71;
    } while (bVar54 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }